

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_avx2.cpp
# Opt level: O2

int __thiscall
ncnn::Convolution_x86_avx2::forward_int8_x86
          (Convolution_x86_avx2 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  short sVar16;
  short sVar17;
  _func_int *p_Var18;
  Layer *pLVar19;
  float fVar20;
  undefined8 uVar21;
  undefined4 uVar22;
  undefined1 uVar23;
  undefined1 uVar25;
  undefined1 uVar27;
  undefined1 uVar29;
  int *piVar30;
  size_t sVar31;
  Allocator *pAVar32;
  undefined1 auVar33 [32];
  undefined8 uVar34;
  void *pvVar35;
  undefined8 uVar36;
  undefined8 uVar37;
  pointer pfVar38;
  pointer pfVar39;
  undefined1 auVar40 [32];
  byte bVar41;
  undefined1 uVar42;
  int i;
  uint uVar43;
  int iVar44;
  int iVar45;
  long lVar46;
  Mat *this_00;
  ulong uVar47;
  _func_int **pp_Var48;
  int iVar49;
  int iVar50;
  int iVar51;
  int iVar52;
  int iVar53;
  int iVar54;
  ulong uVar55;
  ulong uVar56;
  long lVar57;
  ulong uVar58;
  undefined4 *puVar59;
  undefined1 uVar60;
  int iVar61;
  uint uVar62;
  uint uVar63;
  ulong uVar64;
  ulong uVar65;
  long lVar66;
  int iVar67;
  uint uVar68;
  int iVar69;
  int iVar70;
  char *pcVar71;
  int iVar72;
  long lVar73;
  undefined4 *puVar74;
  int iVar75;
  int iVar76;
  long lVar77;
  long lVar78;
  int iVar79;
  undefined1 *puVar80;
  _Vector_base<float,_std::allocator<float>_> *this_01;
  long lVar81;
  undefined8 *puVar82;
  int i_1;
  uint uVar83;
  long lVar84;
  undefined8 *puVar85;
  int n_9;
  long lVar86;
  undefined1 *puVar87;
  undefined1 *puVar88;
  uint uVar89;
  int iVar90;
  int p_4;
  long lVar91;
  undefined1 *puVar92;
  ulong uVar93;
  void *pvVar94;
  undefined4 *puVar95;
  ulong uVar96;
  uint uVar97;
  int iVar98;
  ulong uVar99;
  undefined4 *puVar100;
  int q;
  int iVar101;
  bool bVar102;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar126 [16];
  float fVar127;
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar133 [12];
  undefined1 auVar132 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 in_ZMM3 [64];
  undefined1 in_ZMM5 [64];
  undefined1 in_ZMM9 [64];
  undefined1 in_ZMM15 [64];
  long local_790;
  int local_788;
  undefined1 local_768 [16];
  long local_758;
  long local_748;
  long local_740;
  undefined1 local_738 [16];
  undefined1 local_708 [16];
  undefined1 local_6e8 [16];
  Option opt_q;
  int sum0 [4];
  size_t local_648;
  int iStack_62c;
  Mat img;
  Mat kernel_tm;
  Mat bottom_blob_bordered;
  int sum1 [4];
  size_t local_4e8;
  int local_4cc;
  Mat top_blob_int32;
  vector<float,_std::allocator<float>_> requantize_scales;
  int local_40c;
  short t1 [4];
  int local_3e0;
  int local_3dc;
  size_t local_3d8;
  int local_3bc;
  int sum2 [4];
  size_t sStack_388;
  int iStack_36c;
  undefined1 local_378 [32];
  int sum3 [4];
  size_t local_338;
  int local_31c;
  short t0 [4];
  int local_2f0;
  int local_2ec;
  size_t local_2e8;
  int local_2cc;
  ulong local_2a8;
  int o0 [2];
  short w3 [4];
  size_t local_288;
  int local_26c;
  short w2 [4];
  size_t local_238;
  int local_21c;
  short t3 [4];
  undefined1 auStack_1f0 [24];
  short t2 [4];
  undefined1 auStack_1b0 [24];
  _Vector_base<float,_std::allocator<float>_> local_178;
  _Vector_base<float,_std::allocator<float>_> local_160;
  int sum3_2 [16];
  int sum2_2 [16];
  Mat bottom_blob_int8;
  Option opt_b;
  undefined4 uVar24;
  undefined3 uVar26;
  undefined2 uVar28;
  undefined1 auVar125 [16];
  
  auVar128 = in_ZMM15._0_16_;
  auVar104 = in_ZMM9._0_16_;
  auVar103 = in_ZMM5._0_16_;
  auVar124 = in_ZMM3._0_16_;
  iVar70 = bottom_blob->elempack;
  if (iVar70 == 0) {
    Mat::Mat(&bottom_blob_int8,bottom_blob);
LAB_0017d4f3:
    uVar21._0_1_ = opt->lightmode;
    uVar21._1_3_ = *(undefined3 *)&opt->field_0x1;
    uVar21._4_4_ = opt->num_threads;
    opt_q.workspace_allocator = opt->workspace_allocator;
    uVar22 = opt->openmp_blocktime;
    uVar23 = opt->use_winograd_convolution;
    uVar25 = opt->use_sgemm_convolution;
    uVar27 = opt->use_int8_inference;
    uVar29 = opt->use_vulkan_compute;
    uVar28 = CONCAT11(uVar29,uVar27);
    uVar26 = CONCAT21(uVar28,uVar25);
    uVar24 = CONCAT31(uVar26,uVar23);
    opt_q.use_bf16_storage = opt->use_bf16_storage;
    opt_q.use_fp16_packed = opt->use_fp16_packed;
    opt_q.use_fp16_storage = opt->use_fp16_storage;
    opt_q.use_fp16_arithmetic = opt->use_fp16_arithmetic;
    opt_q.use_int8_packed = opt->use_int8_packed;
    opt_q.use_int8_storage = opt->use_int8_storage;
    opt_q.use_int8_arithmetic = opt->use_int8_arithmetic;
    opt_q.use_packing_layout = opt->use_packing_layout;
    opt_q.use_shader_pack8 = opt->use_shader_pack8;
    opt_q.use_subgroup_basic = opt->use_subgroup_basic;
    opt_q.use_subgroup_vote = opt->use_subgroup_vote;
    opt_q.use_subgroup_ballot = opt->use_subgroup_ballot;
    opt_q.use_subgroup_shuffle = opt->use_subgroup_shuffle;
    opt_q.use_image_storage = opt->use_image_storage;
    opt_q.use_tensor_storage = opt->use_tensor_storage;
    opt_q.use_weight_fp16_storage = opt->use_weight_fp16_storage;
    opt_q.flush_denormals = opt->flush_denormals;
    opt_q.use_local_pool_allocator = opt->use_local_pool_allocator;
    opt_q.use_reserved_1 = opt->use_reserved_1;
    opt_q.use_reserved_2 = opt->use_reserved_2;
    opt_q.use_reserved_3 = opt->use_reserved_3;
    opt_q.use_reserved_4 = opt->use_reserved_4;
    opt_q.use_reserved_5 = opt->use_reserved_5;
    opt_q.use_reserved_6 = opt->use_reserved_6;
    opt_q.use_reserved_7 = opt->use_reserved_7;
    opt_q.use_reserved_8 = opt->use_reserved_8;
    opt_q.use_reserved_9 = opt->use_reserved_9;
    opt_q.use_reserved_10 = opt->use_reserved_10;
    opt_q.use_reserved_11 = opt->use_reserved_11;
    opt_q._0_4_ = SUB84(uVar21,0);
    opt_q.blob_allocator._0_4_ = SUB84(opt->workspace_allocator,0);
    opt_q.blob_allocator._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    in_ZMM3 = ZEXT1664(auVar124);
    in_ZMM5 = ZEXT1664(auVar103);
    in_ZMM9 = ZEXT1664(auVar104);
    in_ZMM15 = ZEXT1664(auVar128);
    opt_q.num_threads = uVar21._4_4_;
    opt_q.openmp_blocktime = uVar22;
    opt_q._28_4_ = uVar24;
    quantize_to_int8(bottom_blob,&bottom_blob_int8,
                     (Mat *)(&this->field_0x238 + (long)this->_vptr_Convolution_x86_avx2[-3]),&opt_q
                    );
  }
  else {
    sVar31 = bottom_blob->elemsize;
    Mat::Mat(&bottom_blob_int8,bottom_blob);
    auVar128 = in_ZMM15._0_16_;
    auVar104 = in_ZMM9._0_16_;
    auVar103 = in_ZMM5._0_16_;
    auVar124 = in_ZMM3._0_16_;
    if (((int)sVar31 << 3) / iVar70 != 8) goto LAB_0017d4f3;
  }
  bottom_blob_bordered.cstep = 0;
  bottom_blob_bordered.data = (void *)0x0;
  bottom_blob_bordered.refcount._0_4_ = 0;
  bottom_blob_bordered.refcount._4_4_ = 0;
  bottom_blob_bordered.elemsize = 0;
  bottom_blob_bordered.elempack = 0;
  bottom_blob_bordered.allocator = (Allocator *)0x0;
  bottom_blob_bordered.dims = 0;
  bottom_blob_bordered.w = 0;
  bottom_blob_bordered.h = 0;
  bottom_blob_bordered.d = 0;
  bottom_blob_bordered.c = 0;
  Convolution::make_padding
            ((Convolution *)
             ((long)&this->_vptr_Convolution_x86_avx2 + (long)this->_vptr_Convolution_x86_avx2[-3]),
             &bottom_blob_int8,&bottom_blob_bordered,opt);
  iVar69 = bottom_blob_bordered.c;
  iVar54 = bottom_blob_bordered.elempack;
  iVar70 = -100;
  if ((bottom_blob_bordered.data == (void *)0x0) ||
     (bottom_blob_bordered.cstep * (long)bottom_blob_bordered.c == 0)) goto LAB_0017f49e;
  p_Var18 = this->_vptr_Convolution_x86_avx2[-3];
  iVar67 = (~((*(int *)(p_Var18 + 0x34 + (long)&(this->weight_data_3x3_winograd63).data) + -1) *
             *(int *)(p_Var18 + 0x3c + (long)&(this->weight_data_3x3_winograd63).data)) +
           bottom_blob_bordered.w) /
           *(int *)(p_Var18 + 0x44 + (long)&(this->weight_data_3x3_winograd63).data) + 1;
  iVar72 = (~((*(int *)(p_Var18 + 0x38 + (long)&(this->weight_data_3x3_winograd63).data) + -1) *
             *(int *)(p_Var18 + 0x40 + (long)&(this->weight_data_3x3_winograd63).data)) +
           bottom_blob_bordered.h) / *(int *)((long)&this->convolution_dilation1 + (long)p_Var18) +
           1;
  bVar41 = (*(uint *)(p_Var18 + 0x30 + (long)&(this->weight_data_3x3_winograd63).data) & 3) == 0 &
           opt->use_packing_layout;
  uVar97 = (uint)bVar41 + (uint)bVar41 * 2 + 1;
  iVar79 = *(int *)(p_Var18 + 0x18 + (long)&(this->weight_data_int8).data);
  uVar68 = ((uint)bVar41 + (uint)bVar41 * 2) * 4 + 4;
  uVar62 = uVar68;
  if (100 < iVar79) {
    uVar62 = uVar97;
  }
  Mat::create(top_blob,iVar67,iVar72,
              (int)*(uint *)(p_Var18 + 0x30 + (long)&(this->weight_data_3x3_winograd63).data) /
              (int)uVar97,(ulong)uVar62,uVar97,opt->blob_allocator);
  if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
  goto LAB_0017f49e;
  top_blob_int32.cstep = 0;
  top_blob_int32.data = (void *)0x0;
  top_blob_int32.refcount._0_4_ = 0;
  top_blob_int32.refcount._4_4_ = 0;
  top_blob_int32._16_12_ = SUB1612((undefined1  [16])0x0,4);
  top_blob_int32._32_12_ = SUB1612((undefined1  [16])0x0,0);
  top_blob_int32.w = 0;
  top_blob_int32.h = 0;
  top_blob_int32.d = 0;
  top_blob_int32.c = 0;
  Mat::create(&top_blob_int32,iVar67,iVar72,
              *(int *)(this->_vptr_Convolution_x86_avx2[-3] + 0x30 +
                      (long)&(this->weight_data_3x3_winograd63).data) / (int)uVar97,(ulong)uVar68,
              uVar97,opt->workspace_allocator);
  iVar52 = top_blob_int32.c;
  iVar90 = top_blob_int32.h;
  iVar101 = top_blob_int32.w;
  iVar72 = bottom_blob_bordered.c;
  iVar67 = bottom_blob_bordered.w;
  iVar70 = -100;
  if ((top_blob_int32.data != (void *)0x0) && (top_blob_int32.cstep * (long)top_blob_int32.c != 0))
  {
    if (iVar54 == 8 && bVar41 == 1) {
      p_Var18 = this->_vptr_Convolution_x86_avx2[-3];
      uVar68 = *(uint *)(p_Var18 + 0x34 + (long)&(this->weight_data_3x3_winograd63).data);
      if ((uVar68 == 1) &&
         (*(int *)(p_Var18 + 0x38 + (long)&(this->weight_data_3x3_winograd63).data) == 1)) {
        if ((*(int *)(p_Var18 + 0x3c + (long)&(this->weight_data_3x3_winograd63).data) != 1) ||
           (((*(int *)(p_Var18 + 0x40 + (long)&(this->weight_data_3x3_winograd63).data) != 1 ||
             (*(int *)(p_Var18 + 0x44 + (long)&(this->weight_data_3x3_winograd63).data) != 1)) ||
            (*(int *)((long)&this->convolution_dilation1 + (long)p_Var18) != 1)))) {
          if ((((*(int *)(p_Var18 + 0x3c + (long)&(this->weight_data_3x3_winograd63).data) != 1) ||
               (*(int *)(p_Var18 + 0x40 + (long)&(this->weight_data_3x3_winograd63).data) != 1)) ||
              (*(int *)(p_Var18 + 0x44 + (long)&(this->weight_data_3x3_winograd63).data) != 2)) ||
             (*(int *)((long)&this->convolution_dilation1 + (long)p_Var18) != 2)) goto LAB_0017d966;
          opt_q.lightmode = false;
          opt_q._1_3_ = 0;
          opt_q.num_threads = 0;
          opt_q.blob_allocator._0_4_ = 0;
          opt_q.blob_allocator._4_4_ = 0;
          opt_q.workspace_allocator = (Allocator *)0x0;
          opt_q.openmp_blocktime = 0;
          opt_q._32_28_ = ZEXT1228((undefined1  [12])0x0);
          Mat::create((Mat *)&opt_q,top_blob_int32.w,top_blob_int32.h,bottom_blob_bordered.c,
                      bottom_blob_bordered.elemsize,bottom_blob_bordered.elempack,
                      opt->workspace_allocator);
          iVar52 = 0;
          iVar70 = iVar101;
          if (iVar101 < 1) {
            iVar70 = iVar52;
          }
          local_708._0_8_ = &this->weight_data_int8;
          if (iVar90 < 1) {
            iVar90 = 0;
          }
          if (iVar72 < 1) {
            iVar72 = iVar52;
          }
          local_738._0_4_ = iVar72;
          for (; iVar52 != iVar72; iVar52 = iVar52 + 1) {
            Mat::channel(&img,&bottom_blob_bordered,iVar52);
            puVar82 = (undefined8 *)CONCAT44(img.data._4_4_,img.data._0_4_);
            Mat::~Mat(&img);
            Mat::channel(&img,(Mat *)&opt_q,iVar52);
            puVar85 = (undefined8 *)CONCAT44(img.data._4_4_,img.data._0_4_);
            Mat::~Mat(&img);
            for (iVar76 = 0; iVar49 = iVar70, iVar76 != iVar90; iVar76 = iVar76 + 1) {
              while (bVar102 = iVar49 != 0, iVar49 = iVar49 + -1, bVar102) {
                *puVar85 = *puVar82;
                puVar82 = puVar82 + 2;
                puVar85 = puVar85 + 1;
              }
              puVar82 = puVar82 + (iVar67 - iVar101) * 2;
            }
          }
          conv1x1s1_sgemm_pack8to4_int8_sse
                    ((Mat *)&opt_q,&top_blob_int32,&this->weight_data_int8,opt);
          goto LAB_0017df41;
        }
        conv1x1s1_sgemm_pack8to4_int8_sse
                  (&bottom_blob_bordered,&top_blob_int32,&this->weight_data_int8,opt);
      }
      else {
LAB_0017d966:
        uVar62 = *(uint *)(p_Var18 + 0x38 + (long)&(this->weight_data_3x3_winograd63).data);
        iVar70 = *(int *)(p_Var18 + 0x3c + (long)&(this->weight_data_3x3_winograd63).data);
        local_6e8._0_8_ = (long)iVar70;
        iVar76 = *(int *)(p_Var18 + 0x40 + (long)&(this->weight_data_3x3_winograd63).data);
        local_738._0_8_ = (long)iVar76;
        iVar49 = *(int *)(p_Var18 + 0x44 + (long)&(this->weight_data_3x3_winograd63).data);
        iVar45 = *(int *)((long)&this->convolution_dilation1 + (long)p_Var18);
        lVar77 = (long)top_blob_int32.w;
        uVar99 = (ulong)(uint)top_blob_int32.h;
        if (opt->use_sgemm_convolution == true) {
          Mat::Mat((Mat *)&opt_q,top_blob_int32.h * top_blob_int32.w,uVar62 * uVar68,
                   bottom_blob_bordered.c,8,8,opt->workspace_allocator);
          uVar99 = 0;
          iVar52 = iVar101;
          if (iVar101 < 1) {
            iVar52 = 0;
          }
          if (iVar90 < 1) {
            iVar90 = 0;
          }
          uVar47 = (ulong)uVar68;
          if ((int)uVar68 < 1) {
            uVar47 = uVar99;
          }
          uVar93 = (ulong)uVar62;
          if ((int)uVar62 < 1) {
            uVar93 = uVar99;
          }
          uVar55 = (ulong)(uint)iVar72;
          if (iVar72 < 1) {
            uVar55 = uVar99;
          }
          while( true ) {
            iVar72 = (int)uVar99;
            if (iVar72 == (int)uVar55) break;
            Mat::channel(&img,&bottom_blob_bordered,iVar72);
            local_708._0_8_ = uVar99;
            Mat::channel(&kernel_tm,(Mat *)&opt_q,iVar72);
            puVar82 = (undefined8 *)kernel_tm.data;
            Mat::~Mat(&kernel_tm);
            for (uVar99 = 0; uVar99 != uVar93; uVar99 = uVar99 + 1) {
              for (uVar64 = 0; uVar64 != uVar47; uVar64 = uVar64 + 1) {
                puVar85 = (undefined8 *)
                          (img.elemsize * (long)img.w * uVar99 * (long)iVar76 +
                           CONCAT44(img.data._4_4_,img.data._0_4_) + uVar64 * (long)iVar70 * 8);
                for (iVar53 = 0; iVar98 = iVar52, iVar53 != iVar90; iVar53 = iVar53 + 1) {
                  while (iVar98 != 0) {
                    *puVar82 = *puVar85;
                    puVar82 = puVar82 + 1;
                    puVar85 = puVar85 + iVar49;
                    iVar98 = iVar98 + -1;
                  }
                  puVar85 = puVar85 + ((long)(iVar67 * iVar45) - (long)(iVar49 * iVar101));
                }
              }
            }
            Mat::~Mat(&img);
            uVar99 = (ulong)(iVar72 + 1);
          }
          im2col_sgemm_pack8to4_int8_sse((Mat *)&opt_q,&top_blob_int32,&this->weight_data_int8,opt);
LAB_0017df41:
          Mat::~Mat((Mat *)&opt_q);
        }
        else {
          uVar83 = uVar62 * uVar68;
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)&img,(long)(int)uVar83,
                     (allocator_type *)&opt_q);
          uVar43 = 0;
          uVar97 = uVar68;
          if ((int)uVar68 < 1) {
            uVar97 = uVar43;
          }
          if ((int)uVar62 < 1) {
            uVar62 = uVar43;
          }
          lVar91 = CONCAT44(img.data._4_4_,img.data._0_4_);
          iVar98 = 0;
          iVar53 = 0;
          uVar63 = uVar97;
          for (; uVar43 != uVar62; uVar43 = uVar43 + 1) {
            for (lVar84 = (long)iVar53; (int)uVar63 != lVar84; lVar84 = lVar84 + 1) {
              *(int *)(lVar91 + lVar84 * 4) = iVar98;
              iVar98 = iVar98 + iVar70;
            }
            iVar98 = iVar98 + (iVar67 * iVar76 - iVar70 * uVar68);
            uVar63 = uVar63 + uVar97;
            iVar53 = iVar53 + uVar97;
          }
          if ((int)uVar83 < 1) {
            uVar83 = 0;
          }
          if (iVar72 < 1) {
            iVar72 = 0;
          }
          uVar47 = 0;
          if (0 < iVar101) {
            uVar47 = (ulong)(uint)iVar101;
          }
          if (iVar90 < 1) {
            uVar99 = 0;
          }
          if (iVar52 < 1) {
            iVar52 = 0;
          }
          for (iVar70 = 0; iVar70 != iVar52; iVar70 = iVar70 + 1) {
            Mat::channel((Mat *)&opt_q,&top_blob_int32,iVar70);
            local_758 = CONCAT44(opt_q.num_threads,opt_q._0_4_);
            Mat::~Mat((Mat *)&opt_q);
            for (uVar93 = 0; uVar93 != uVar99; uVar93 = uVar93 + 1) {
              for (uVar55 = 0; uVar55 != uVar47; uVar55 = uVar55 + 1) {
                Mat::channel((Mat *)&opt_q,&this->weight_data_int8,iVar70);
                lVar84 = CONCAT44(opt_q.num_threads,opt_q._0_4_);
                Mat::~Mat((Mat *)&opt_q);
                local_768 = (undefined1  [16])0x0;
                local_738 = (undefined1  [16])0x0;
                local_708 = (undefined1  [16])0x0;
                local_6e8 = (undefined1  [16])0x0;
                for (iVar67 = 0; iVar67 != iVar72; iVar67 = iVar67 + 1) {
                  Mat::channel((Mat *)&opt_q,&bottom_blob_bordered,iVar67);
                  for (lVar73 = 0; (ulong)uVar83 * 4 != lVar73; lVar73 = lVar73 + 4) {
                    auVar103._8_8_ = 0;
                    auVar103._0_8_ =
                         *(ulong *)((long)(int)opt_q._44_4_ * uVar93 * (long)iVar45 *
                                    (long)opt_q.workspace_allocator +
                                    CONCAT44(opt_q.num_threads,opt_q._0_4_) +
                                    (long)(iVar49 * 8 * (int)uVar55) +
                                   (long)*(int *)(lVar91 + lVar73) * 8);
                    auVar124 = vpcmpgtb_avx((undefined1  [16])0x0,auVar103);
                    auVar107 = vpunpcklbw_avx(auVar103,auVar124);
                    auVar124 = *(undefined1 (*) [16])(lVar84 + lVar73 * 8);
                    auVar103 = *(undefined1 (*) [16])(lVar84 + 0x10 + lVar73 * 8);
                    auVar104 = vpcmpgtb_avx((undefined1  [16])0x0,auVar124);
                    auVar128 = vpcmpgtb_avx((undefined1  [16])0x0,auVar103);
                    auVar105 = vpunpcklbw_avx(auVar124,auVar104);
                    auVar124 = vpunpckhbw_avx(auVar124,auVar104);
                    auVar104 = vpunpcklbw_avx(auVar103,auVar128);
                    auVar103 = vpunpckhbw_avx(auVar103,auVar128);
                    auVar108 = vpmullw_avx(auVar107,auVar105);
                    auVar105 = vpmulhw_avx(auVar107,auVar105);
                    auVar109 = vpmullw_avx(auVar107,auVar124);
                    auVar129 = vpmulhw_avx(auVar107,auVar124);
                    auVar110 = vpmullw_avx(auVar107,auVar104);
                    auVar106 = vpmulhw_avx(auVar107,auVar104);
                    auVar111 = vpmullw_avx(auVar107,auVar103);
                    auVar107 = vpmulhw_avx(auVar107,auVar103);
                    auVar124 = vpunpcklwd_avx(auVar108,auVar105);
                    auVar124 = vpaddd_avx(auVar124,local_6e8);
                    auVar103 = vpunpcklwd_avx(auVar109,auVar129);
                    auVar103 = vpaddd_avx(auVar103,local_708);
                    in_ZMM9 = ZEXT1664(auVar103);
                    auVar104 = vpunpcklwd_avx(auVar110,auVar106);
                    auVar104 = vpaddd_avx(auVar104,local_738);
                    auVar128 = vpunpcklwd_avx(auVar111,auVar107);
                    auVar128 = vpaddd_avx(auVar128,local_768);
                    auVar105 = vpunpckhwd_avx(auVar108,auVar105);
                    local_6e8 = vpaddd_avx(auVar124,auVar105);
                    auVar124 = vpunpckhwd_avx(auVar109,auVar129);
                    local_708 = vpaddd_avx(auVar103,auVar124);
                    auVar124 = vpunpckhwd_avx(auVar110,auVar106);
                    local_738 = vpaddd_avx(auVar104,auVar124);
                    auVar124 = vpunpckhwd_avx(auVar111,auVar107);
                    local_768 = vpaddd_avx(auVar128,auVar124);
                  }
                  lVar84 = lVar84 + (ulong)uVar83 * 0x20;
                  Mat::~Mat((Mat *)&opt_q);
                }
                in_ZMM5 = ZEXT1664(local_6e8);
                auVar124 = vpunpckldq_avx(local_6e8,local_708);
                auVar128 = vpunpckldq_avx(local_738,local_768);
                auVar103 = vpunpckhdq_avx(local_6e8,local_708);
                auVar104 = vpunpckhdq_avx(local_738,local_768);
                in_ZMM3 = ZEXT1664(auVar104);
                auVar105 = vpunpcklqdq_avx(auVar124,auVar128);
                auVar124 = vpunpckhqdq_avx(auVar124,auVar128);
                auVar124 = vpaddd_avx(auVar105,auVar124);
                auVar128 = vpunpcklqdq_avx(auVar103,auVar104);
                auVar103 = vpunpckhqdq_avx(auVar103,auVar104);
                auVar103 = vpaddd_avx(auVar103,auVar128);
                auVar124 = vpaddd_avx(auVar124,auVar103);
                *(undefined1 (*) [16])(local_758 + uVar55 * 0x10) = auVar124;
              }
              local_758 = local_758 + lVar77 * 0x10;
            }
          }
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    ((_Vector_base<int,_std::allocator<int>_> *)&img);
        }
      }
      Mat::Mat((Mat *)&opt_q,
               *(int *)(this->_vptr_Convolution_x86_avx2[-3] + 0x30 +
                       (long)&(this->weight_data_3x3_winograd63).data),4,(Allocator *)0x0);
      pp_Var48 = this->_vptr_Convolution_x86_avx2;
      for (lVar77 = 0; p_Var18 = pp_Var48[-3],
          lVar77 < *(int *)(p_Var18 + 0x30 + (long)&(this->weight_data_3x3_winograd63).data);
          lVar77 = lVar77 + 1) {
        fVar1 = *(float *)(*(long *)(&this->field_0x1f0 + (long)p_Var18) + lVar77 * 4);
        fVar127 = 0.0;
        if (fVar1 != 0.0) {
          fVar127 = 1.0 / (fVar1 * **(float **)(&this->field_0x238 + (long)p_Var18));
        }
        *(float *)(CONCAT44(opt_q.num_threads,opt_q._0_4_) + lVar77 * 4) = fVar127;
      }
      if (iVar79 < 0x65) {
        dequantize_from_int32
                  (&top_blob_int32,top_blob,(Mat *)&opt_q,
                   (Mat *)(&this->field_0x1a8 + (long)p_Var18),opt);
        pLVar19 = this->activation;
        if (pLVar19 != (Layer *)0x0) {
          (*pLVar19->_vptr_Layer[9])(pLVar19,top_blob,opt);
        }
      }
      else {
        requantize_from_int32_to_int8
                  (&top_blob_int32,top_blob,(Mat *)&opt_q,
                   (Mat *)(&this->field_0x280 + (long)p_Var18),
                   (Mat *)(&this->field_0x1a8 + (long)p_Var18),
                   *(int *)(p_Var18 + 0x1c + (long)&(this->weight_data_int8).data),
                   (Mat *)(p_Var18 + 0x20 + (long)&(this->weight_data_int8).data),opt);
      }
      Mat::~Mat((Mat *)&opt_q);
    }
    iVar90 = top_blob_int32.c;
    iVar101 = top_blob_int32.h;
    iVar72 = top_blob_int32.w;
    iVar67 = bottom_blob_bordered.c;
    iVar70 = bottom_blob_bordered.w;
    if (iVar54 == 1 && bVar41 == 1) {
      p_Var18 = this->_vptr_Convolution_x86_avx2[-3];
      iVar52 = *(int *)(p_Var18 + 0x34 + (long)&(this->weight_data_3x3_winograd63).data);
      iVar76 = *(int *)(p_Var18 + 0x38 + (long)&(this->weight_data_3x3_winograd63).data);
      iVar49 = *(int *)(p_Var18 + 0x3c + (long)&(this->weight_data_3x3_winograd63).data);
      iVar45 = *(int *)(p_Var18 + 0x40 + (long)&(this->weight_data_3x3_winograd63).data);
      iVar53 = *(int *)(p_Var18 + 0x44 + (long)&(this->weight_data_3x3_winograd63).data);
      iVar98 = *(int *)((long)&this->convolution_dilation1 + (long)p_Var18);
      lVar77 = (long)top_blob_int32.w;
      uVar99 = (ulong)(uint)top_blob_int32.h;
      uVar68 = iVar76 * iVar52;
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&img,(long)(int)uVar68,
                 (allocator_type *)&opt_q);
      iVar44 = 0;
      iVar51 = iVar52;
      if (iVar52 < 1) {
        iVar51 = iVar44;
      }
      if (iVar76 < 1) {
        iVar76 = iVar44;
      }
      lVar91 = CONCAT44(img.data._4_4_,img.data._0_4_);
      iVar61 = 0;
      iVar75 = 0;
      iVar50 = iVar51;
      for (; iVar44 != iVar76; iVar44 = iVar44 + 1) {
        for (lVar84 = (long)iVar75; iVar50 != lVar84; lVar84 = lVar84 + 1) {
          *(int *)(lVar91 + lVar84 * 4) = iVar61;
          iVar61 = iVar61 + iVar49;
        }
        iVar61 = iVar61 + (iVar70 * iVar45 - iVar49 * iVar52);
        iVar50 = iVar50 + iVar51;
        iVar75 = iVar75 + iVar51;
      }
      uVar93 = 0;
      uVar47 = (ulong)uVar68;
      if ((int)uVar68 < 1) {
        uVar47 = uVar93;
      }
      if (iVar67 < 1) {
        iVar67 = 0;
      }
      local_738._0_4_ = iVar67;
      uVar55 = 0;
      if (0 < iVar72) {
        uVar55 = (ulong)(uint)iVar72;
      }
      if (iVar101 < 1) {
        uVar99 = uVar93;
      }
      if (iVar90 < 1) {
        iVar90 = 0;
      }
      local_6e8._0_8_ = uVar47 * 4;
      while (iVar70 = (int)uVar93, iVar70 != iVar90) {
        Mat::channel((Mat *)&opt_q,&top_blob_int32,iVar70);
        local_790 = CONCAT44(opt_q.num_threads,opt_q._0_4_);
        Mat::~Mat((Mat *)&opt_q);
        for (uVar93 = 0; uVar93 != uVar99; uVar93 = uVar93 + 1) {
          lVar84 = uVar93 * (long)iVar98;
          local_708._0_8_ = lVar84;
          for (uVar64 = 0; uVar64 != uVar55; uVar64 = uVar64 + 1) {
            Mat::channel((Mat *)&opt_q,&this->weight_data_int8,iVar70);
            lVar73 = CONCAT44(opt_q.num_threads,opt_q._0_4_);
            Mat::~Mat((Mat *)&opt_q);
            local_768 = (undefined1  [16])0x0;
            for (iVar72 = 0; iVar72 != iVar67; iVar72 = iVar72 + 1) {
              Mat::channel((Mat *)&opt_q,&bottom_blob_bordered,iVar72);
              for (uVar56 = 0; uVar47 != uVar56; uVar56 = uVar56 + 1) {
                auVar104._0_2_ =
                     (short)*(char *)((int)opt_q._44_4_ * lVar84 * (long)opt_q.workspace_allocator +
                                      CONCAT44(opt_q.num_threads,opt_q._0_4_) +
                                      uVar64 * (long)iVar53 + (long)*(int *)(lVar91 + uVar56 * 4));
                auVar104._2_2_ = auVar104._0_2_;
                auVar104._4_2_ = auVar104._0_2_;
                auVar104._6_2_ = auVar104._0_2_;
                auVar104._8_2_ = auVar104._0_2_;
                auVar104._10_2_ = auVar104._0_2_;
                auVar104._12_2_ = auVar104._0_2_;
                auVar104._14_2_ = auVar104._0_2_;
                auVar128._8_8_ = 0;
                auVar128._0_8_ = *(ulong *)(lVar73 + uVar56 * 4);
                auVar124 = vpcmpgtb_avx((undefined1  [16])0x0,auVar128);
                auVar124 = vpunpcklbw_avx(auVar128,auVar124);
                auVar103 = vpmullw_avx(auVar104,auVar124);
                auVar124 = vpmulhw_avx(auVar104,auVar124);
                auVar124 = vpunpcklwd_avx(auVar103,auVar124);
                local_768 = vpaddd_avx(local_768,auVar124);
              }
              lVar73 = lVar73 + uVar47 * 4;
              Mat::~Mat((Mat *)&opt_q);
            }
            *(undefined1 (*) [16])(local_790 + uVar64 * 0x10) = local_768;
          }
          local_790 = local_790 + lVar77 * 0x10;
        }
        uVar93 = (ulong)(iVar70 + 1);
      }
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&img);
      Mat::Mat((Mat *)&opt_q,
               *(int *)(this->_vptr_Convolution_x86_avx2[-3] + 0x30 +
                       (long)&(this->weight_data_3x3_winograd63).data),4,(Allocator *)0x0);
      pp_Var48 = this->_vptr_Convolution_x86_avx2;
      for (lVar77 = 0; p_Var18 = pp_Var48[-3],
          lVar77 < *(int *)(p_Var18 + 0x30 + (long)&(this->weight_data_3x3_winograd63).data);
          lVar77 = lVar77 + 1) {
        fVar1 = *(float *)(*(long *)(&this->field_0x1f0 + (long)p_Var18) + lVar77 * 4);
        fVar127 = 0.0;
        if (fVar1 != 0.0) {
          fVar127 = 1.0 / (fVar1 * **(float **)(&this->field_0x238 + (long)p_Var18));
        }
        *(float *)(CONCAT44(opt_q.num_threads,opt_q._0_4_) + lVar77 * 4) = fVar127;
      }
      if (iVar79 < 0x65) {
        dequantize_from_int32
                  (&top_blob_int32,top_blob,(Mat *)&opt_q,
                   (Mat *)(&this->field_0x1a8 + (long)p_Var18),opt);
        pLVar19 = this->activation;
        if (pLVar19 != (Layer *)0x0) {
          (*pLVar19->_vptr_Layer[9])(pLVar19,top_blob,opt);
        }
      }
      else {
        requantize_from_int32_to_int8
                  (&top_blob_int32,top_blob,(Mat *)&opt_q,
                   (Mat *)(&this->field_0x280 + (long)p_Var18),
                   (Mat *)(&this->field_0x1a8 + (long)p_Var18),
                   *(int *)(p_Var18 + 0x1c + (long)&(this->weight_data_int8).data),
                   (Mat *)(p_Var18 + 0x20 + (long)&(this->weight_data_int8).data),opt);
      }
      Mat::~Mat((Mat *)&opt_q);
    }
    iVar90 = top_blob_int32.c;
    iVar101 = top_blob_int32.h;
    iVar72 = top_blob_int32.w;
    iVar67 = bottom_blob_bordered.c;
    iVar70 = bottom_blob_bordered.w;
    if ((iVar54 == 8) && (bVar41 != 1)) {
      p_Var18 = this->_vptr_Convolution_x86_avx2[-3];
      iVar52 = *(int *)(p_Var18 + 0x34 + (long)&(this->weight_data_3x3_winograd63).data);
      iVar76 = *(int *)(p_Var18 + 0x38 + (long)&(this->weight_data_3x3_winograd63).data);
      iVar49 = *(int *)(p_Var18 + 0x3c + (long)&(this->weight_data_3x3_winograd63).data);
      iVar45 = *(int *)(p_Var18 + 0x40 + (long)&(this->weight_data_3x3_winograd63).data);
      iVar53 = *(int *)(p_Var18 + 0x44 + (long)&(this->weight_data_3x3_winograd63).data);
      iVar98 = *(int *)((long)&this->convolution_dilation1 + (long)p_Var18);
      lVar77 = (long)top_blob_int32.w;
      uVar99 = (ulong)(uint)top_blob_int32.h;
      uVar68 = iVar76 * iVar52;
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&img,(long)(int)uVar68,
                 (allocator_type *)&opt_q);
      iVar44 = 0;
      iVar51 = iVar52;
      if (iVar52 < 1) {
        iVar51 = iVar44;
      }
      if (iVar76 < 1) {
        iVar76 = iVar44;
      }
      lVar91 = CONCAT44(img.data._4_4_,img.data._0_4_);
      iVar61 = 0;
      iVar75 = 0;
      iVar50 = iVar51;
      for (; iVar44 != iVar76; iVar44 = iVar44 + 1) {
        for (lVar84 = (long)iVar75; iVar50 != lVar84; lVar84 = lVar84 + 1) {
          *(int *)(lVar91 + lVar84 * 4) = iVar61;
          iVar61 = iVar61 + iVar49;
        }
        iVar61 = iVar61 + (iVar70 * iVar45 - iVar49 * iVar52);
        iVar50 = iVar50 + iVar51;
        iVar75 = iVar75 + iVar51;
      }
      uVar93 = 0;
      uVar47 = (ulong)uVar68;
      if ((int)uVar68 < 1) {
        uVar47 = uVar93;
      }
      if (iVar67 < 1) {
        iVar67 = 0;
      }
      uVar55 = 0;
      if (0 < iVar72) {
        uVar55 = (ulong)(uint)iVar72;
      }
      if (iVar101 < 1) {
        uVar99 = uVar93;
      }
      if (iVar90 < 1) {
        iVar90 = 0;
      }
      local_6e8._0_8_ = uVar47 * 8;
      while (iVar70 = (int)uVar93, iVar70 != iVar90) {
        Mat::channel((Mat *)&opt_q,&top_blob_int32,iVar70);
        local_790 = CONCAT44(opt_q.num_threads,opt_q._0_4_);
        Mat::~Mat((Mat *)&opt_q);
        for (uVar93 = 0; uVar93 != uVar99; uVar93 = uVar93 + 1) {
          lVar84 = uVar93 * (long)iVar98;
          local_708._0_8_ = lVar84;
          for (uVar64 = 0; uVar64 != uVar55; uVar64 = uVar64 + 1) {
            Mat::channel((Mat *)&opt_q,&this->weight_data_int8,iVar70);
            lVar73 = CONCAT44(opt_q.num_threads,opt_q._0_4_);
            Mat::~Mat((Mat *)&opt_q);
            local_788 = (int)uVar64;
            lVar46 = (long)(iVar53 * 8 * local_788);
            local_738._0_8_ = lVar46;
            iVar72 = 0;
            for (iVar101 = 0; iVar101 != iVar67; iVar101 = iVar101 + 1) {
              Mat::channel((Mat *)&opt_q,&bottom_blob_bordered,iVar101);
              for (uVar56 = 0; uVar47 != uVar56; uVar56 = uVar56 + 1) {
                auVar105._8_8_ = 0;
                auVar105._0_8_ =
                     *(ulong *)((int)opt_q._44_4_ * lVar84 * (long)opt_q.workspace_allocator +
                                CONCAT44(opt_q.num_threads,opt_q._0_4_) + lVar46 +
                               (long)*(int *)(lVar91 + uVar56 * 4) * 8);
                auVar124 = vpcmpgtb_avx((undefined1  [16])0x0,auVar105);
                auVar104 = vpunpcklbw_avx(auVar105,auVar124);
                auVar129._8_8_ = 0;
                auVar129._0_8_ = *(ulong *)(lVar73 + uVar56 * 8);
                auVar124 = vpcmpgtb_avx((undefined1  [16])0x0,auVar129);
                auVar124 = vpunpcklbw_avx(auVar129,auVar124);
                auVar103 = vpmullw_avx(auVar124,auVar104);
                auVar124 = vpmulhw_avx(auVar104,auVar124);
                auVar104 = vpunpcklwd_avx(auVar103,auVar124);
                auVar124 = vpunpckhwd_avx(auVar103,auVar124);
                auVar124 = vpaddd_avx(auVar104,auVar124);
                auVar124 = vphaddd_avx(auVar124,auVar124);
                auVar124 = vphaddd_avx(auVar124,auVar124);
                iVar72 = iVar72 + auVar124._0_4_;
              }
              lVar73 = lVar73 + uVar47 * 8;
              Mat::~Mat((Mat *)&opt_q);
            }
            *(int *)(local_790 + uVar64 * 4) = iVar72;
          }
          local_790 = local_790 + lVar77 * 4;
        }
        uVar93 = (ulong)(iVar70 + 1);
      }
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&img);
      Mat::Mat((Mat *)&opt_q,
               *(int *)(this->_vptr_Convolution_x86_avx2[-3] + 0x30 +
                       (long)&(this->weight_data_3x3_winograd63).data),4,(Allocator *)0x0);
      pp_Var48 = this->_vptr_Convolution_x86_avx2;
      for (lVar77 = 0; p_Var18 = pp_Var48[-3],
          lVar77 < *(int *)(p_Var18 + 0x30 + (long)&(this->weight_data_3x3_winograd63).data);
          lVar77 = lVar77 + 1) {
        fVar1 = *(float *)(*(long *)(&this->field_0x1f0 + (long)p_Var18) + lVar77 * 4);
        fVar127 = 0.0;
        if (fVar1 != 0.0) {
          fVar127 = 1.0 / (fVar1 * **(float **)(&this->field_0x238 + (long)p_Var18));
        }
        *(float *)(CONCAT44(opt_q.num_threads,opt_q._0_4_) + lVar77 * 4) = fVar127;
      }
      if (iVar79 < 0x65) {
        dequantize_from_int32
                  (&top_blob_int32,top_blob,(Mat *)&opt_q,
                   (Mat *)(&this->field_0x1a8 + (long)p_Var18),opt);
        pLVar19 = this->activation;
        if (pLVar19 != (Layer *)0x0) {
          (*pLVar19->_vptr_Layer[9])(pLVar19,top_blob,opt);
        }
      }
      else {
        requantize_from_int32_to_int8
                  (&top_blob_int32,top_blob,(Mat *)&opt_q,
                   (Mat *)(&this->field_0x280 + (long)p_Var18),
                   (Mat *)(&this->field_0x1a8 + (long)p_Var18),
                   *(int *)(p_Var18 + 0x1c + (long)&(this->weight_data_int8).data),
                   (Mat *)(p_Var18 + 0x20 + (long)&(this->weight_data_int8).data),opt);
      }
      Mat::~Mat((Mat *)&opt_q);
    }
    iVar52 = top_blob_int32.c;
    iVar90 = top_blob_int32.h;
    iVar101 = top_blob_int32.w;
    iVar72 = bottom_blob_bordered.c;
    iVar67 = bottom_blob_bordered.w;
    auVar33 = (undefined1  [32])opt_q._32_32_;
    iVar70 = 0;
    if (bVar41 == 0 && iVar54 == 1) {
      pp_Var48 = this->_vptr_Convolution_x86_avx2;
      if (((((opt->use_winograd_convolution == true) &&
            (p_Var18 = pp_Var48[-3],
            *(int *)(p_Var18 + 0x34 + (long)&(this->weight_data_3x3_winograd63).data) == 3)) &&
           (*(int *)(p_Var18 + 0x38 + (long)&(this->weight_data_3x3_winograd63).data) == 3)) &&
          ((*(int *)(p_Var18 + 0x3c + (long)&(this->weight_data_3x3_winograd63).data) == 1 &&
           (*(int *)(p_Var18 + 0x40 + (long)&(this->weight_data_3x3_winograd63).data) == 1)))) &&
         (((*(int *)(p_Var18 + 0x44 + (long)&(this->weight_data_3x3_winograd63).data) == 1 &&
           ((*(int *)((long)&this->convolution_dilation1 + (long)p_Var18) == 1 &&
            (0xf < iVar54 * iVar69)))) &&
          (0xf < *(int *)(p_Var18 + 0x30 + (long)&(this->weight_data_3x3_winograd63).data))))) {
        lVar77 = (long)bottom_blob_bordered.c;
        piVar30 = (int *)CONCAT44(bottom_blob_bordered.refcount._4_4_,
                                  bottom_blob_bordered.refcount._0_4_);
        opt_q._0_4_ = SUB84(bottom_blob_bordered.data,0);
        opt_q.num_threads = (int)((ulong)bottom_blob_bordered.data >> 0x20);
        opt_q.blob_allocator._0_4_ = bottom_blob_bordered.refcount._0_4_;
        opt_q.blob_allocator._4_4_ = bottom_blob_bordered.refcount._4_4_;
        opt_q.workspace_allocator = (Allocator *)bottom_blob_bordered.elemsize;
        opt_q.openmp_blocktime = bottom_blob_bordered.elempack;
        opt_q.use_subgroup_shuffle = (bool)(undefined1)bottom_blob_bordered.w;
        opt_q.use_image_storage = (bool)bottom_blob_bordered.w._1_1_;
        opt_q.use_tensor_storage = (bool)bottom_blob_bordered.w._2_1_;
        opt_q.use_weight_fp16_storage = (bool)bottom_blob_bordered.w._3_1_;
        opt_q.use_shader_pack8 = (bool)(undefined1)bottom_blob_bordered.dims;
        opt_q.use_subgroup_basic = (bool)bottom_blob_bordered.dims._1_1_;
        opt_q.use_subgroup_vote = (bool)bottom_blob_bordered.dims._2_1_;
        opt_q.use_subgroup_ballot = (bool)bottom_blob_bordered.dims._3_1_;
        opt_q.use_local_pool_allocator = (bool)(undefined1)bottom_blob_bordered.d;
        opt_q.use_reserved_1 = (bool)bottom_blob_bordered.d._1_1_;
        opt_q.use_reserved_2 = (bool)bottom_blob_bordered.d._2_1_;
        opt_q.use_reserved_3 = (bool)bottom_blob_bordered.d._3_1_;
        opt_q.flush_denormals = bottom_blob_bordered.h;
        opt_q._32_8_ = bottom_blob_bordered.allocator;
        opt_q._60_4_ = auVar33._28_4_;
        opt_q.use_reserved_4 = (bool)(undefined1)bottom_blob_bordered.c;
        opt_q.use_reserved_5 = (bool)bottom_blob_bordered.c._1_1_;
        opt_q.use_reserved_6 = (bool)bottom_blob_bordered.c._2_1_;
        opt_q.use_reserved_7 = (bool)bottom_blob_bordered.c._3_1_;
        if (piVar30 != (int *)0x0) {
          LOCK();
          *piVar30 = *piVar30 + 1;
          UNLOCK();
        }
        uVar68 = (top_blob_int32.w + 1) / 2;
        uVar99 = (long)(top_blob_int32.h + 1) / 2;
        iVar70 = (int)uVar99;
        iVar54 = uVar68 * 2 + 2;
        opt_b.lightmode = opt->lightmode;
        opt_b._1_3_ = *(undefined3 *)&opt->field_0x1;
        opt_b.num_threads = opt->num_threads;
        opt_b.workspace_allocator = opt->workspace_allocator;
        opt_b.openmp_blocktime = opt->openmp_blocktime;
        opt_b.use_winograd_convolution = opt->use_winograd_convolution;
        opt_b.use_sgemm_convolution = opt->use_sgemm_convolution;
        opt_b.use_int8_inference = opt->use_int8_inference;
        opt_b.use_vulkan_compute = opt->use_vulkan_compute;
        opt_b.use_bf16_storage = opt->use_bf16_storage;
        opt_b.use_fp16_packed = opt->use_fp16_packed;
        opt_b.use_fp16_storage = opt->use_fp16_storage;
        opt_b.use_fp16_arithmetic = opt->use_fp16_arithmetic;
        opt_b.use_int8_packed = opt->use_int8_packed;
        opt_b.use_int8_storage = opt->use_int8_storage;
        opt_b.use_int8_arithmetic = opt->use_int8_arithmetic;
        opt_b.use_packing_layout = opt->use_packing_layout;
        opt_b.use_shader_pack8 = opt->use_shader_pack8;
        opt_b.use_subgroup_basic = opt->use_subgroup_basic;
        opt_b.use_subgroup_vote = opt->use_subgroup_vote;
        opt_b.use_subgroup_ballot = opt->use_subgroup_ballot;
        opt_b.use_subgroup_shuffle = opt->use_subgroup_shuffle;
        opt_b.use_image_storage = opt->use_image_storage;
        opt_b.use_tensor_storage = opt->use_tensor_storage;
        opt_b.use_weight_fp16_storage = opt->use_weight_fp16_storage;
        opt_b.flush_denormals = opt->flush_denormals;
        opt_b.use_local_pool_allocator = opt->use_local_pool_allocator;
        opt_b.use_reserved_1 = opt->use_reserved_1;
        opt_b.use_reserved_2 = opt->use_reserved_2;
        opt_b.use_reserved_3 = opt->use_reserved_3;
        opt_b.use_reserved_4 = opt->use_reserved_4;
        opt_b.use_reserved_5 = opt->use_reserved_5;
        opt_b.use_reserved_6 = opt->use_reserved_6;
        opt_b.use_reserved_7 = opt->use_reserved_7;
        opt_b.use_reserved_8 = opt->use_reserved_8;
        opt_b.use_reserved_9 = opt->use_reserved_9;
        opt_b.use_reserved_10 = opt->use_reserved_10;
        opt_b.use_reserved_11 = opt->use_reserved_11;
        opt_b.blob_allocator = opt->workspace_allocator;
        copy_make_border(&bottom_blob_bordered,(Mat *)&opt_q,0,
                         (iVar70 * 2 - bottom_blob_bordered.h) + 2,0,iVar54 - bottom_blob_bordered.w
                         ,0,0.0,&opt_b);
        img.cstep = 0;
        img.data._0_4_ = 0;
        img.data._4_4_ = 0;
        img.refcount._0_4_ = 0;
        img.refcount._4_4_ = 0;
        img.elemsize = 0;
        img.elempack = 0;
        img._32_12_ = SUB1612((undefined1  [16])0x0,0);
        img.w = 0;
        img._48_12_ = SUB1612((undefined1  [16])0x0,4);
        uVar97 = iVar70 * uVar68;
        Mat::create(&img,0x10,uVar97,iVar72,2,opt->workspace_allocator);
        lVar91 = (long)iVar54;
        iVar69 = 0;
        uVar62 = 0;
        if (0 < (int)uVar68) {
          uVar62 = uVar68;
        }
        this_00 = &this->weight_data_3x3_winograd23_int8;
        uVar99 = uVar99 & 0xffffffff;
        if (iVar70 < 1) {
          uVar99 = 0;
        }
        iVar67 = 0;
        if (0 < iVar72) {
          iVar67 = iVar72;
        }
        for (; iVar69 != iVar67; iVar69 = iVar69 + 1) {
          Mat::channel(&kernel_tm,(Mat *)&opt_q,iVar69);
          pvVar35 = kernel_tm.data;
          Mat::~Mat(&kernel_tm);
          Mat::channel(&kernel_tm,&img,iVar69);
          pvVar94 = kernel_tm.data;
          Mat::~Mat(&kernel_tm);
          for (uVar47 = 0; uVar47 != uVar99; uVar47 = uVar47 + 1) {
            lVar57 = (long)(iVar54 * 2 * (int)uVar47) + (long)pvVar35;
            lVar84 = lVar57 + lVar91;
            lVar73 = lVar84 + lVar91;
            lVar46 = lVar73 + lVar91;
            for (uVar83 = 0; uVar83 != uVar62; uVar83 = uVar83 + 1) {
              for (lVar86 = 0; lVar86 != 4; lVar86 = lVar86 + 1) {
                *(short *)((long)&kernel_tm.data + lVar86 * 2) = (short)*(char *)(lVar57 + lVar86);
                *(short *)((long)sum0 + lVar86 * 2) = (short)*(char *)(lVar84 + lVar86);
                *(short *)((long)&requantize_scales.
                                  super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                  super__Vector_impl_data._M_start + lVar86 * 2) =
                     (short)*(char *)(lVar73 + lVar86);
                *(short *)((long)sum1 + lVar86 * 2) = (short)*(char *)(lVar46 + lVar86);
              }
              for (lVar86 = 0; auVar40 = _t2, auVar33 = _t3, lVar86 != 8; lVar86 = lVar86 + 2) {
                sVar16 = *(short *)((long)&requantize_scales.
                                           super__Vector_base<float,_std::allocator<float>_>._M_impl
                                           .super__Vector_impl_data._M_start + lVar86);
                *(short *)((long)sum2 + lVar86) =
                     *(short *)((long)&kernel_tm.data + lVar86) - sVar16;
                sVar17 = *(short *)((long)sum0 + lVar86);
                *(short *)((long)sum3 + lVar86) = sVar17 + sVar16;
                *(short *)((long)w2 + lVar86) = sVar16 - sVar17;
                *(short *)((long)w3 + lVar86) = *(short *)((long)sum1 + lVar86) - sVar17;
              }
              t0[0] = (short)sum2[0];
              t1[0] = sum2[0]._2_2_;
              t0[1] = (short)sum3[0];
              t1[1] = sum3[0]._2_2_;
              t2[1] = (short)sum3[1];
              t2[0] = (short)sum2[1];
              t3[1] = sum3[1]._2_2_;
              t3[0] = sum2[1]._2_2_;
              t0[2] = w2[0];
              t1[2] = w2[1];
              t2[2] = w2[2];
              t3[2] = w2[3];
              t0[3] = w3[0];
              t1[3] = w3[1];
              auStack_1b0 = auVar40._8_24_;
              t2[3] = w3[2];
              auStack_1f0 = auVar33._8_24_;
              t3[3] = w3[3];
              for (lVar86 = 0; lVar86 != 8; lVar86 = lVar86 + 2) {
                sVar16 = *(short *)((long)t2 + lVar86);
                *(short *)((long)&kernel_tm.data + lVar86) = *(short *)((long)t0 + lVar86) - sVar16;
                sVar17 = *(short *)((long)t1 + lVar86);
                *(short *)((long)sum0 + lVar86) = sVar17 + sVar16;
                *(short *)((long)&requantize_scales.
                                  super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                  super__Vector_impl_data._M_start + lVar86) = sVar16 - sVar17;
                *(short *)((long)sum1 + lVar86) = *(short *)((long)t3 + lVar86) - sVar17;
              }
              for (lVar86 = 0; lVar86 != 8; lVar86 = lVar86 + 2) {
                *(undefined2 *)((long)pvVar94 + lVar86) =
                     *(undefined2 *)((long)&kernel_tm.data + lVar86);
                *(undefined2 *)((long)pvVar94 + lVar86 + 8) = *(undefined2 *)((long)sum0 + lVar86);
                *(undefined2 *)((long)pvVar94 + lVar86 + 0x10) =
                     *(undefined2 *)
                      ((long)&requantize_scales.super__Vector_base<float,_std::allocator<float>_>.
                              _M_impl.super__Vector_impl_data._M_start + lVar86);
                *(undefined2 *)((long)pvVar94 + lVar86 + 0x18) =
                     *(undefined2 *)((long)sum1 + lVar86);
              }
              lVar57 = lVar57 + 2;
              lVar84 = lVar84 + 2;
              lVar73 = lVar73 + 2;
              lVar46 = lVar46 + 2;
              pvVar94 = (void *)((long)pvVar94 + 0x20);
            }
          }
        }
        kernel_tm.cstep = 0;
        kernel_tm.data = (void *)0x0;
        kernel_tm.refcount._0_4_ = 0;
        kernel_tm.refcount._4_4_ = 0;
        kernel_tm._16_12_ = SUB1612((undefined1  [16])0x0,4);
        kernel_tm._32_12_ = SUB1612((undefined1  [16])0x0,0);
        kernel_tm.w = 0;
        kernel_tm._48_12_ = SUB1612((undefined1  [16])0x0,4);
        Mat::operator=((Mat *)&opt_q,&kernel_tm);
        Mat::~Mat(&kernel_tm);
        kernel_tm.cstep = 0;
        kernel_tm.data = (void *)0x0;
        kernel_tm.refcount._0_4_ = 0;
        kernel_tm.refcount._4_4_ = 0;
        kernel_tm._16_12_ = SUB1612((undefined1  [16])0x0,4);
        kernel_tm._32_12_ = SUB1612((undefined1  [16])0x0,0);
        kernel_tm.w = 0;
        kernel_tm._48_12_ = SUB1612((undefined1  [16])0x0,4);
        Mat::create(&kernel_tm,0x10,uVar97,iVar52,4,opt->workspace_allocator);
        iVar54 = iVar52 >> 2;
        uVar83 = iVar52 & 0xfffffffc;
        uVar93 = 0;
        uVar47 = (ulong)uVar97;
        if ((int)uVar97 < 1) {
          uVar47 = uVar93;
        }
        if (iVar54 < 1) {
          iVar54 = 0;
        }
        while( true ) {
          iVar69 = (int)uVar93;
          if (iVar69 == iVar54) break;
          uVar97 = iVar69 * 4;
          Mat::channel((Mat *)sum0,&kernel_tm,uVar97);
          Mat::channel((Mat *)&requantize_scales,&kernel_tm,uVar97 | 1);
          Mat::channel((Mat *)sum1,&kernel_tm,uVar97 | 2);
          local_738._0_4_ = uVar97;
          Mat::channel((Mat *)sum2,&kernel_tm,uVar97 | 3);
          Mat::channel((Mat *)sum3,this_00,uVar97);
          Mat::channel((Mat *)w2,this_00,uVar97 | 1);
          Mat::channel((Mat *)w3,this_00,uVar97 | 2);
          Mat::channel((Mat *)t0,this_00,uVar97 | 3);
          for (uVar93 = 0;
              pfVar39 = requantize_scales.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage, uVar34 = sum1._0_8_,
              uVar21 = sum0._0_8_, uVar93 != uVar47; uVar93 = uVar93 + 1) {
            pfVar38 = requantize_scales.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start;
            uVar36 = sum2._0_8_;
            sVar31 = sStack_388;
            _t2 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            _t3 = _t2;
            sum2_2[8] = t2._0_4_;
            sum2_2[9] = t2._4_4_;
            sum2_2[10] = t2._8_4_;
            sum2_2[0xb] = t2._12_4_;
            sum2_2[0xc] = t2._16_4_;
            sum2_2[0xd] = t2._20_4_;
            sum2_2[0xe] = t2._24_4_;
            sum2_2[0xf] = t2._28_4_;
            sum2_2[0] = t2._0_4_;
            sum2_2[1] = t2._4_4_;
            sum2_2[2] = t2._8_4_;
            sum2_2[3] = t2._12_4_;
            sum2_2[4] = t2._16_4_;
            sum2_2[5] = t2._20_4_;
            sum2_2[6] = t2._24_4_;
            sum2_2[7] = t2._28_4_;
            sum3_2[8] = t2._0_4_;
            sum3_2[9] = t2._4_4_;
            sum3_2[10] = t2._8_4_;
            sum3_2[0xb] = t2._12_4_;
            sum3_2[0xc] = t2._16_4_;
            sum3_2[0xd] = t2._20_4_;
            sum3_2[0xe] = t2._24_4_;
            sum3_2[0xf] = t2._28_4_;
            sum3_2[0] = t2._0_4_;
            sum3_2[1] = t2._4_4_;
            sum3_2[2] = t2._8_4_;
            sum3_2[3] = t2._12_4_;
            sum3_2[4] = t2._16_4_;
            sum3_2[5] = t2._20_4_;
            sum3_2[6] = t2._24_4_;
            sum3_2[7] = t2._28_4_;
            uVar55 = 0;
            while( true ) {
              if (lVar77 <= (long)(uVar55 | 3)) break;
              uVar97 = (uint)uVar55;
              Mat::channel((Mat *)t1,&img,uVar97);
              lVar91 = CONCAT26(t1[3],CONCAT24(t1[2],CONCAT22(t1[1],t1[0])));
              local_708._0_8_ = (long)local_3bc;
              Mat::~Mat((Mat *)t1);
              Mat::channel((Mat *)t1,&img,uVar97 | 1);
              local_6e8._0_8_ = local_3d8;
              lVar84 = CONCAT26(t1[3],CONCAT24(t1[2],CONCAT22(t1[1],t1[0])));
              Mat::~Mat((Mat *)t1);
              local_738._0_8_ = uVar55;
              Mat::channel((Mat *)t1,&img,uVar97 | 2);
              lVar73 = CONCAT26(t1[3],CONCAT24(t1[2],CONCAT22(t1[1],t1[0])));
              Mat::~Mat((Mat *)t1);
              Mat::channel((Mat *)t1,&img,uVar97 | 3);
              lVar46 = CONCAT26(t1[3],CONCAT24(t1[2],CONCAT22(t1[1],t1[0])));
              Mat::~Mat((Mat *)t1);
              lVar57 = CONCAT26(t0[3],CONCAT24(t0[2],CONCAT22(t0[1],t0[0]))) +
                       local_2e8 * uVar55 * (long)local_2cc;
              lVar86 = CONCAT26(w3[3],CONCAT24(w3[2],CONCAT22(w3[1],w3[0]))) +
                       local_288 * uVar55 * (long)local_26c;
              lVar66 = CONCAT26(w2[3],CONCAT24(w2[2],CONCAT22(w2[1],w2[0]))) +
                       local_238 * uVar55 * (long)local_21c;
              lVar78 = sum3._0_8_ + local_338 * uVar55 * (long)local_31c;
              for (lVar81 = 0; lVar81 != 0x20; lVar81 = lVar81 + 2) {
                iVar67 = (int)*(short *)(lVar91 + local_3d8 * uVar93 * (long)local_3bc + lVar81);
                iVar72 = (int)*(short *)(lVar84 + local_3d8 * uVar93 * (long)local_3bc + lVar81);
                iVar101 = (int)*(short *)(lVar73 + local_3d8 * uVar93 * (long)local_3bc + lVar81);
                iVar90 = (int)*(short *)(local_3d8 * uVar93 * (long)local_3bc + lVar46 + lVar81);
                *(int *)(t2 + lVar81) =
                     *(short *)(lVar78 + 0x60 + lVar81) * iVar90 +
                     *(short *)(lVar78 + 0x40 + lVar81) * iVar101 +
                     *(short *)(lVar78 + 0x20 + lVar81) * iVar72 +
                     *(short *)(lVar78 + lVar81) * iVar67 + *(int *)(t2 + lVar81);
                *(int *)(t3 + lVar81) =
                     *(short *)(lVar66 + 0x60 + lVar81) * iVar90 +
                     *(short *)(lVar66 + 0x40 + lVar81) * iVar101 +
                     *(short *)(lVar66 + 0x20 + lVar81) * iVar72 +
                     *(short *)(lVar66 + lVar81) * iVar67 + *(int *)(t3 + lVar81);
                *(int *)((long)sum2_2 + lVar81 * 2) =
                     *(short *)(lVar86 + 0x60 + lVar81) * iVar90 +
                     *(short *)(lVar86 + 0x40 + lVar81) * iVar101 +
                     *(short *)(lVar86 + 0x20 + lVar81) * iVar72 +
                     *(short *)(lVar86 + lVar81) * iVar67 + *(int *)((long)sum2_2 + lVar81 * 2);
                *(int *)((long)sum3_2 + lVar81 * 2) =
                     *(short *)(lVar57 + 0x60 + lVar81) * iVar90 +
                     *(short *)(lVar57 + 0x40 + lVar81) * iVar101 +
                     *(short *)(lVar57 + 0x20 + lVar81) * iVar72 +
                     *(short *)(lVar57 + lVar81) * iVar67 + *(int *)((long)sum3_2 + lVar81 * 2);
              }
              uVar55 = uVar55 + 4;
            }
            for (; (long)uVar55 < lVar77; uVar55 = uVar55 + 1) {
              Mat::channel((Mat *)t1,&img,(int)uVar55);
              lVar91 = CONCAT26(t1[3],CONCAT24(t1[2],CONCAT22(t1[1],t1[0])));
              Mat::~Mat((Mat *)t1);
              for (lVar84 = 0; lVar84 != 0x20; lVar84 = lVar84 + 2) {
                iVar67 = (int)*(short *)(local_3d8 * uVar93 * (long)local_3bc + lVar91 + lVar84);
                *(int *)(t2 + lVar84) =
                     *(int *)(t2 + lVar84) +
                     *(short *)(local_338 * uVar55 * (long)local_31c + sum3._0_8_ + lVar84) * iVar67
                ;
                *(int *)(t3 + lVar84) =
                     *(int *)(t3 + lVar84) +
                     *(short *)(local_238 * uVar55 * (long)local_21c +
                                CONCAT26(w2[3],CONCAT24(w2[2],CONCAT22(w2[1],w2[0]))) + lVar84) *
                     iVar67;
                piVar30 = (int *)((long)sum2_2 + lVar84 * 2);
                *piVar30 = *piVar30 +
                           *(short *)(local_288 * uVar55 * (long)local_26c +
                                      CONCAT26(w3[3],CONCAT24(w3[2],CONCAT22(w3[1],w3[0]))) + lVar84
                                     ) * iVar67;
                piVar30 = (int *)((long)sum3_2 + lVar84 * 2);
                *piVar30 = *piVar30 +
                           *(short *)(local_2e8 * uVar55 * (long)local_2cc +
                                      CONCAT26(t0[3],CONCAT24(t0[2],CONCAT22(t0[1],t0[0]))) + lVar84
                                     ) * iVar67;
              }
            }
            for (lVar91 = 0; lVar91 != 0x40; lVar91 = lVar91 + 4) {
              *(undefined4 *)(uVar21 + local_648 * uVar93 * (long)iStack_62c + lVar91) =
                   *(undefined4 *)((long)t2 + lVar91);
              *(undefined4 *)((long)pfVar38 + lVar91 + (long)pfVar39 * uVar93 * (long)local_40c) =
                   *(undefined4 *)((long)t3 + lVar91);
              *(undefined4 *)(uVar34 + local_4e8 * uVar93 * (long)local_4cc + lVar91) =
                   *(undefined4 *)((long)sum2_2 + lVar91);
              *(undefined4 *)(uVar36 + sVar31 * uVar93 * (long)iStack_36c + lVar91) =
                   *(undefined4 *)((long)sum3_2 + lVar91);
            }
          }
          Mat::~Mat((Mat *)t0);
          Mat::~Mat((Mat *)w3);
          Mat::~Mat((Mat *)w2);
          Mat::~Mat((Mat *)sum3);
          Mat::~Mat((Mat *)sum2);
          Mat::~Mat((Mat *)sum1);
          Mat::~Mat((Mat *)&requantize_scales);
          Mat::~Mat((Mat *)sum0);
          uVar93 = (ulong)(iVar69 + 1);
        }
        for (; (int)uVar83 < iVar52; uVar83 = uVar83 + 1) {
          Mat::channel((Mat *)sum0,&kernel_tm,uVar83);
          Mat::channel((Mat *)&requantize_scales,this_00,uVar83);
          for (uVar93 = 0; uVar21 = sum0._0_8_, uVar93 != uVar47; uVar93 = uVar93 + 1) {
            _sum2 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            local_738._0_8_ = 1;
            local_708._0_8_ = 2;
            local_6e8._0_8_ = 3;
            uVar55 = 0;
            while( true ) {
              if (lVar77 <= (long)(uVar55 | 3)) break;
              uVar97 = (uint)uVar55;
              Mat::channel((Mat *)sum1,&img,uVar97);
              uVar34 = sum1._0_8_;
              Mat::~Mat((Mat *)sum1);
              Mat::channel((Mat *)sum1,&img,uVar97 | 1);
              uVar36 = sum1._0_8_;
              Mat::~Mat((Mat *)sum1);
              Mat::channel((Mat *)sum1,&img,uVar97 | 2);
              uVar37 = sum1._0_8_;
              Mat::~Mat((Mat *)sum1);
              Mat::channel((Mat *)sum1,&img,uVar97 | 3);
              lVar73 = local_4e8 * uVar93 * (long)local_4cc + sum1._0_8_;
              Mat::~Mat((Mat *)sum1);
              lVar91 = (long)local_40c;
              for (lVar84 = 0; lVar84 != 0x20; lVar84 = lVar84 + 2) {
                *(int *)((long)sum2 + lVar84 * 2) =
                     (int)*(short *)((long)requantize_scales.
                                           super__Vector_base<float,_std::allocator<float>_>._M_impl
                                           .super__Vector_impl_data._M_start +
                                    lVar84 + (long)requantize_scales.
                                                   super__Vector_base<float,_std::allocator<float>_>
                                                   ._M_impl.super__Vector_impl_data.
                                                   _M_end_of_storage * local_6e8._0_8_ * lVar91) *
                     (int)*(short *)(lVar73 + lVar84) +
                     (int)*(short *)((long)requantize_scales.
                                           super__Vector_base<float,_std::allocator<float>_>._M_impl
                                           .super__Vector_impl_data._M_start +
                                    lVar84 + (long)requantize_scales.
                                                   super__Vector_base<float,_std::allocator<float>_>
                                                   ._M_impl.super__Vector_impl_data.
                                                   _M_end_of_storage * local_708._0_8_ * lVar91) *
                     (int)*(short *)(uVar37 + local_4e8 * uVar93 * (long)local_4cc + lVar84) +
                     (int)*(short *)((long)requantize_scales.
                                           super__Vector_base<float,_std::allocator<float>_>._M_impl
                                           .super__Vector_impl_data._M_start +
                                    lVar84 + (long)requantize_scales.
                                                   super__Vector_base<float,_std::allocator<float>_>
                                                   ._M_impl.super__Vector_impl_data.
                                                   _M_end_of_storage * local_738._0_8_ * lVar91) *
                     (int)*(short *)(uVar36 + local_4e8 * uVar93 * (long)local_4cc + lVar84) +
                     (int)*(short *)((long)requantize_scales.
                                           super__Vector_base<float,_std::allocator<float>_>._M_impl
                                           .super__Vector_impl_data._M_start +
                                    lVar84 + (long)requantize_scales.
                                                   super__Vector_base<float,_std::allocator<float>_>
                                                   ._M_impl.super__Vector_impl_data.
                                                   _M_end_of_storage * uVar55 * lVar91) *
                     (int)*(short *)(uVar34 + local_4e8 * uVar93 * (long)local_4cc + lVar84) +
                     *(int *)((long)sum2 + lVar84 * 2);
              }
              uVar55 = uVar55 + 4;
              local_6e8._0_8_ = local_6e8._0_8_ + 4;
              local_708._0_8_ = local_708._0_8_ + 4;
              local_738._0_8_ = local_738._0_8_ + 4;
            }
            for (; (long)uVar55 < lVar77; uVar55 = uVar55 + 1) {
              Mat::channel((Mat *)sum1,&img,(int)uVar55);
              lVar84 = local_4e8 * uVar93 * (long)local_4cc + sum1._0_8_;
              Mat::~Mat((Mat *)sum1);
              for (lVar91 = 0; lVar91 != 0x10; lVar91 = lVar91 + 1) {
                sum2[lVar91] = sum2[lVar91] +
                               (int)*(short *)((long)requantize_scales.
                                                                                                          
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_start +
                                              lVar91 * 2 +
                                              (long)requantize_scales.
                                                                                                        
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage
                                              * uVar55 * (long)local_40c) *
                               (int)*(short *)(lVar84 + lVar91 * 2);
              }
            }
            for (lVar91 = 0; lVar91 != 0x10; lVar91 = lVar91 + 1) {
              *(int *)(uVar21 + local_648 * uVar93 * (long)iStack_62c + lVar91 * 4) = sum2[lVar91];
            }
          }
          Mat::~Mat((Mat *)&requantize_scales);
          Mat::~Mat((Mat *)sum0);
        }
        sum0[0] = 0;
        sum0[1] = 0;
        sum0[2] = 0;
        sum0[3] = 0;
        Mat::operator=(&img,(Mat *)sum0);
        Mat::~Mat((Mat *)sum0);
        sum0[0] = 0;
        sum0[1] = 0;
        sum0[2] = 0;
        sum0[3] = 0;
        Mat::create((Mat *)sum0,uVar68 * 2,iVar70 * 2,iVar52,4,opt->workspace_allocator);
        iVar70 = 0;
        if (iVar52 < 1) {
          iVar52 = 0;
        }
        for (; iVar70 != iVar52; iVar70 = iVar70 + 1) {
          Mat::channel((Mat *)&requantize_scales,&kernel_tm,iVar70);
          Mat::channel((Mat *)sum1,(Mat *)sum0,iVar70);
          lVar77 = 0;
          for (uVar47 = 0; uVar47 != uVar99; uVar47 = uVar47 + 1) {
            puVar82 = (undefined8 *)(uVar47 * 2 * (long)local_4cc * local_4e8 + sum1._0_8_);
            puVar85 = (undefined8 *)((uVar47 * 2 + 1) * (long)local_4cc * local_4e8 + sum1._0_8_);
            lVar91 = (long)requantize_scales.super__Vector_base<float,_std::allocator<float>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage * lVar77;
            for (uVar93 = 0; uVar93 != uVar62; uVar93 = uVar93 + 1) {
              lVar73 = local_40c * lVar91;
              for (lVar84 = 0; lVar84 != 0x10; lVar84 = lVar84 + 4) {
                *(undefined4 *)((long)sum2 + lVar84) =
                     *(undefined4 *)
                      ((long)requantize_scales.super__Vector_base<float,_std::allocator<float>_>.
                             _M_impl.super__Vector_impl_data._M_start + lVar84 + lVar73);
                *(undefined4 *)((long)sum3 + lVar84) =
                     *(undefined4 *)
                      ((long)requantize_scales.super__Vector_base<float,_std::allocator<float>_>.
                             _M_impl.super__Vector_impl_data._M_start + lVar84 + lVar73 + 0x10);
                *(undefined4 *)((long)w2 + lVar84) =
                     *(undefined4 *)
                      ((long)requantize_scales.super__Vector_base<float,_std::allocator<float>_>.
                             _M_impl.super__Vector_impl_data._M_start + lVar84 + lVar73 + 0x20);
                *(undefined4 *)((long)w3 + lVar84) =
                     *(undefined4 *)
                      ((long)requantize_scales.super__Vector_base<float,_std::allocator<float>_>.
                             _M_impl.super__Vector_impl_data._M_start + lVar84 + lVar73 + 0x30);
              }
              for (lVar84 = 0; auVar40 = _t2, auVar33 = _t3, lVar84 != 0x10; lVar84 = lVar84 + 4) {
                *(int *)((long)t0 + lVar84) =
                     *(int *)((long)sum2 + lVar84) + *(int *)((long)sum3 + lVar84) +
                     *(int *)((long)w2 + lVar84);
                *(int *)((long)t1 + lVar84) =
                     (*(int *)((long)sum3 + lVar84) - *(int *)((long)w2 + lVar84)) +
                     *(int *)((long)w3 + lVar84);
              }
              t2[1] = t0[1];
              t2[0] = t0[0];
              t3[1] = t0[3];
              t3[0] = t0[2];
              t2[3] = t1[1];
              t2[2] = t1[0];
              t3[3] = t1[3];
              t3[2] = t1[2];
              auStack_1b0 = auVar40._8_24_;
              auStack_1f0 = auVar33._8_24_;
              sum2_2[1] = local_3e0;
              sum2_2[0] = local_2f0;
              sum3_2[1] = local_3dc;
              sum3_2[0] = local_2ec;
              for (lVar84 = 0; lVar84 != 8; lVar84 = lVar84 + 4) {
                *(int *)((long)o0 + lVar84) =
                     *(int *)((long)t2 + lVar84) + *(int *)((long)t3 + lVar84) +
                     *(int *)((long)sum2_2 + lVar84);
                *(int *)((long)o0 + lVar84 + -8) =
                     (*(int *)((long)t3 + lVar84) - *(int *)((long)sum2_2 + lVar84)) +
                     *(int *)((long)sum3_2 + lVar84);
              }
              auVar125._8_8_ = 0;
              auVar125._0_4_ = o0[0];
              auVar125._4_4_ = o0[1];
              auVar124 = vpsrad_avx(auVar125,2);
              *puVar82 = auVar124._0_8_;
              auVar126._8_8_ = 0;
              auVar126._0_8_ = local_2a8;
              auVar124 = vpsrad_avx(auVar126,2);
              *puVar85 = auVar124._0_8_;
              puVar82 = puVar82 + 1;
              puVar85 = puVar85 + 1;
              lVar91 = lVar91 + (long)requantize_scales.
                                      super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                      super__Vector_impl_data._M_end_of_storage;
            }
            lVar77 = lVar77 + (int)uVar68;
          }
          Mat::~Mat((Mat *)sum1);
          Mat::~Mat((Mat *)&requantize_scales);
        }
        copy_cut_border((Mat *)sum0,&top_blob_int32,0,-top_blob_int32.h,0,-top_blob_int32.w,opt);
        Mat::~Mat((Mat *)sum0);
        Mat::~Mat(&kernel_tm);
        Mat::~Mat(&img);
        Mat::~Mat((Mat *)&opt_q);
        Mat::Mat((Mat *)&opt_q,
                 *(int *)(this->_vptr_Convolution_x86_avx2[-3] + 0x30 +
                         (long)&(this->weight_data_3x3_winograd63).data),4,(Allocator *)0x0);
        pp_Var48 = this->_vptr_Convolution_x86_avx2;
        for (lVar77 = 0; p_Var18 = pp_Var48[-3],
            lVar77 < *(int *)(p_Var18 + 0x30 + (long)&(this->weight_data_3x3_winograd63).data);
            lVar77 = lVar77 + 1) {
          fVar1 = *(float *)(*(long *)(&this->field_0x1f0 + (long)p_Var18) + lVar77 * 4);
          fVar127 = 0.0;
          if (fVar1 != 0.0) {
            fVar127 = 1.0 / (fVar1 * **(float **)(&this->field_0x238 + (long)p_Var18));
          }
          *(float *)(CONCAT44(opt_q.num_threads,opt_q._0_4_) + lVar77 * 4) = fVar127;
        }
        if (iVar79 < 0x65) {
          dequantize_from_int32
                    (&top_blob_int32,top_blob,(Mat *)&opt_q,
                     (Mat *)(&this->field_0x1a8 + (long)p_Var18),opt);
          pLVar19 = this->activation;
          if (pLVar19 != (Layer *)0x0) {
            (*pLVar19->_vptr_Layer[9])(pLVar19,top_blob,opt);
          }
        }
        else {
          requantize_from_int32_to_int8
                    (&top_blob_int32,top_blob,(Mat *)&opt_q,
                     (Mat *)(&this->field_0x280 + (long)p_Var18),
                     (Mat *)(&this->field_0x1a8 + (long)p_Var18),
                     *(int *)(p_Var18 + 0x1c + (long)&(this->weight_data_int8).data),
                     (Mat *)(p_Var18 + 0x20 + (long)&(this->weight_data_int8).data),opt);
        }
LAB_0017f481:
        Mat::~Mat((Mat *)&opt_q);
      }
      else {
        p_Var18 = pp_Var48[-3];
        iVar70 = *(int *)(p_Var18 + 0x3c + (long)&(this->weight_data_3x3_winograd63).data);
        if ((((opt->use_sgemm_convolution != true) || (iVar70 != 1)) ||
            (iVar70 = 1,
            *(int *)(p_Var18 + 0x40 + (long)&(this->weight_data_3x3_winograd63).data) != 1)) ||
           (1 < *(uint *)(p_Var18 + 0x1c + (long)&(this->weight_data_int8).data))) {
          iVar54 = *(int *)(p_Var18 + 0x34 + (long)&(this->weight_data_3x3_winograd63).data);
          iVar69 = *(int *)(p_Var18 + 0x38 + (long)&(this->weight_data_3x3_winograd63).data);
          iVar76 = *(int *)(p_Var18 + 0x40 + (long)&(this->weight_data_3x3_winograd63).data);
          iVar49 = *(int *)(p_Var18 + 0x44 + (long)&(this->weight_data_3x3_winograd63).data);
          iVar45 = *(int *)((long)&this->convolution_dilation1 + (long)p_Var18);
          lVar77 = (long)top_blob_int32.w;
          uVar47 = (ulong)(uint)top_blob_int32.h;
          uVar99 = (ulong)(uint)top_blob_int32.c;
          uVar68 = iVar69 * iVar54;
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)&img,(long)(int)uVar68,
                     (allocator_type *)&opt_q);
          iVar98 = 0;
          iVar53 = iVar54;
          if (iVar54 < 1) {
            iVar53 = iVar98;
          }
          if (iVar69 < 1) {
            iVar69 = iVar98;
          }
          lVar91 = CONCAT44(img.data._4_4_,img.data._0_4_);
          iVar44 = 0;
          iVar51 = iVar53;
          for (iVar50 = 0; iVar50 != iVar69; iVar50 = iVar50 + 1) {
            for (lVar84 = (long)iVar44; iVar51 != lVar84; lVar84 = lVar84 + 1) {
              *(int *)(lVar91 + lVar84 * 4) = iVar98;
              iVar98 = iVar98 + iVar70;
            }
            iVar98 = iVar98 + (iVar67 * iVar76 - iVar70 * iVar54);
            iVar51 = iVar51 + iVar53;
            iVar44 = iVar44 + iVar53;
          }
          uVar55 = 0;
          uVar93 = (ulong)uVar68;
          if ((int)uVar68 < 1) {
            uVar93 = uVar55;
          }
          uVar64 = (ulong)(uint)iVar72;
          if (iVar72 < 1) {
            uVar64 = uVar55;
          }
          uVar56 = 0;
          if (0 < iVar101) {
            uVar56 = (ulong)(uint)iVar101;
          }
          if (iVar90 < 1) {
            uVar47 = uVar55;
          }
          if (iVar52 < 1) {
            uVar99 = uVar55;
          }
          for (uVar55 = 0; uVar55 != uVar99; uVar55 = uVar55 + 1) {
            Mat::channel((Mat *)&opt_q,&top_blob_int32,(int)uVar55);
            local_790 = CONCAT44(opt_q.num_threads,opt_q._0_4_);
            Mat::~Mat((Mat *)&opt_q);
            for (uVar65 = 0; uVar65 != uVar47; uVar65 = uVar65 + 1) {
              for (uVar96 = 0; uVar96 != uVar56; uVar96 = uVar96 + 1) {
                lVar84 = *(long *)(p_Var18 + 0x28 +
                                  (long)&(this->weight_data_3x3_winograd23_int8).data) +
                         (long)(int)(iVar72 * uVar68 * (int)uVar55);
                iVar70 = 0;
                for (iVar54 = 0; iVar54 != (int)uVar64; iVar54 = iVar54 + 1) {
                  Mat::channel((Mat *)&opt_q,&bottom_blob_bordered,iVar54);
                  for (uVar58 = 0; uVar93 != uVar58; uVar58 = uVar58 + 1) {
                    iVar70 = iVar70 + (int)*(char *)(lVar84 + uVar58) *
                                      (int)*(char *)((long)(int)opt_q._44_4_ * uVar65 * (long)iVar45
                                                     * (long)opt_q.workspace_allocator +
                                                     CONCAT44(opt_q.num_threads,opt_q._0_4_) +
                                                     uVar96 * (long)iVar49 +
                                                    (long)*(int *)(lVar91 + uVar58 * 4));
                  }
                  lVar84 = lVar84 + (int)uVar68;
                  Mat::~Mat((Mat *)&opt_q);
                }
                *(int *)(local_790 + uVar96 * 4) = iVar70;
              }
              local_790 = local_790 + lVar77 * 4;
            }
          }
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    ((_Vector_base<int,_std::allocator<int>_> *)&img);
          Mat::Mat((Mat *)&opt_q,
                   *(int *)(this->_vptr_Convolution_x86_avx2[-3] + 0x30 +
                           (long)&(this->weight_data_3x3_winograd63).data),4,(Allocator *)0x0);
          pp_Var48 = this->_vptr_Convolution_x86_avx2;
          for (lVar77 = 0; p_Var18 = pp_Var48[-3],
              lVar77 < *(int *)(p_Var18 + 0x30 + (long)&(this->weight_data_3x3_winograd63).data);
              lVar77 = lVar77 + 1) {
            fVar1 = *(float *)(*(long *)(&this->field_0x1f0 + (long)p_Var18) + lVar77 * 4);
            fVar127 = 0.0;
            if (fVar1 != 0.0) {
              fVar127 = 1.0 / (fVar1 * **(float **)(&this->field_0x238 + (long)p_Var18));
            }
            *(float *)(CONCAT44(opt_q.num_threads,opt_q._0_4_) + lVar77 * 4) = fVar127;
          }
          if (iVar79 < 0x65) {
            dequantize_from_int32
                      (&top_blob_int32,top_blob,(Mat *)&opt_q,
                       (Mat *)(&this->field_0x1a8 + (long)p_Var18),opt);
            pLVar19 = this->activation;
            if (pLVar19 != (Layer *)0x0) {
              (*pLVar19->_vptr_Layer[9])(pLVar19,top_blob,opt);
            }
          }
          else {
            requantize_from_int32_to_int8
                      (&top_blob_int32,top_blob,(Mat *)&opt_q,
                       (Mat *)(&this->field_0x280 + (long)p_Var18),
                       (Mat *)(&this->field_0x1a8 + (long)p_Var18),
                       *(int *)(p_Var18 + 0x1c + (long)&(this->weight_data_int8).data),
                       (Mat *)(p_Var18 + 0x20 + (long)&(this->weight_data_int8).data),opt);
          }
          goto LAB_0017f481;
        }
        if (iVar79 < 0x65) {
          local_740 = 3;
          local_748 = 2;
          requantize_scales.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          requantize_scales.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          requantize_scales.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          for (lVar77 = 0; p_Var18 = pp_Var48[-3],
              lVar77 < *(int *)(p_Var18 + 0x30 + (long)&(this->weight_data_3x3_winograd63).data);
              lVar77 = lVar77 + 1) {
            fVar1 = *(float *)(*(long *)(&this->field_0x1f0 + (long)p_Var18) + lVar77 * 4);
            opt_q._0_4_ = 0.0;
            if (fVar1 != 0.0) {
              opt_q._0_4_ = 1.0 / (fVar1 * **(float **)(&this->field_0x238 + (long)p_Var18));
            }
            std::vector<float,_std::allocator<float>_>::push_back
                      (&requantize_scales,(value_type_conflict4 *)&opt_q);
            pp_Var48 = this->_vptr_Convolution_x86_avx2;
          }
          uVar68 = *(uint *)(p_Var18 + 0x34 + (long)&(this->weight_data_3x3_winograd63).data);
          iVar70 = *(int *)(p_Var18 + 0x38 + (long)&(this->weight_data_3x3_winograd63).data);
          iVar54 = *(int *)(p_Var18 + 0x44 + (long)&(this->weight_data_3x3_winograd63).data);
          iVar69 = *(int *)((long)&this->convolution_dilation1 + (long)p_Var18);
          std::vector<float,_std::allocator<float>_>::vector
                    ((vector<float,_std::allocator<float>_> *)&local_178,&requantize_scales);
          iVar90 = bottom_blob_bordered.c;
          iVar101 = bottom_blob_bordered.w;
          iVar79 = top_blob->w;
          iVar67 = top_blob->h;
          iVar72 = top_blob->c;
          uVar99 = (ulong)iVar72;
          lVar77 = *(long *)(p_Var18 + 0x28 + (long)&(this->weight_data_3x3_winograd23_int8).data);
          lVar91 = *(long *)(&this->field_0x1a8 + (long)p_Var18);
          iVar52 = iVar70 * uVar68;
          iVar76 = bottom_blob_bordered.c * iVar52;
          uVar62 = iVar67 * iVar79;
          Mat::Mat((Mat *)&opt_q,iVar76,uVar62,1,opt->workspace_allocator);
          if ((int)uVar68 < 1) {
            uVar68 = 0;
          }
          if (iVar70 < 1) {
            iVar70 = 0;
          }
          iVar49 = 0;
          if (0 < iVar90) {
            iVar49 = iVar90;
          }
          lVar84 = CONCAT44(opt_q.num_threads,opt_q._0_4_);
          if (iVar79 < 1) {
            iVar79 = 0;
          }
          iVar45 = 0;
          if (iVar67 < 1) {
            iVar67 = 0;
          }
          iVar98 = 0;
          for (iVar53 = 0; iVar53 != iVar67; iVar53 = iVar53 + 1) {
            iVar51 = iVar45;
            for (iVar44 = 0; iVar44 != iVar79; iVar44 = iVar44 + 1) {
              for (iVar50 = 0; iVar50 != iVar49; iVar50 = iVar50 + 1) {
                Mat::channel(&img,&bottom_blob_bordered,iVar50);
                lVar73 = CONCAT44(img.data._4_4_,img.data._0_4_);
                Mat::~Mat(&img);
                iVar75 = iVar51;
                for (iVar61 = 0; iVar61 != iVar70; iVar61 = iVar61 + 1) {
                  for (uVar47 = 0; uVar68 != uVar47; uVar47 = uVar47 + 1) {
                    *(undefined1 *)(iVar98 + lVar84 + uVar47) =
                         *(undefined1 *)(lVar73 + (iVar75 + (int)uVar47));
                  }
                  iVar98 = iVar98 + (int)uVar47;
                  iVar75 = iVar75 + iVar101;
                }
              }
              iVar51 = iVar51 + iVar54;
            }
            iVar45 = iVar45 + iVar69 * iVar101;
          }
          lVar84 = 1;
          Mat::Mat(&img,iVar52 * 4,iVar90,((int)uVar62 / 4) * -3 + uVar62,1,opt->workspace_allocator
                  );
          uVar93 = 0;
          uVar47 = (ulong)(uint)((int)uVar62 >> 2);
          if ((int)uVar62 >> 2 < 1) {
            uVar47 = uVar93;
          }
          for (uVar55 = 0; pAVar32 = opt_q.workspace_allocator, uVar55 != uVar47;
              uVar55 = uVar55 + 1) {
            lVar73 = CONCAT44(opt_q.num_threads,opt_q._0_4_);
            lVar66 = (long)(int)opt_q._44_4_;
            Mat::channel(&kernel_tm,&img,(int)uVar55);
            pvVar35 = kernel_tm.data;
            Mat::~Mat(&kernel_tm);
            lVar46 = (long)pAVar32 * local_748 * lVar66 + lVar73;
            lVar57 = (long)pAVar32 * local_740 * lVar66 + lVar73;
            lVar86 = (long)pAVar32 * lVar84 * lVar66 + lVar73;
            lVar73 = (long)pAVar32 * uVar93 * lVar66 + lVar73;
            for (lVar66 = 0; (int)lVar66 + 1 < iVar76; lVar66 = lVar66 + 2) {
              *(undefined1 *)((long)pvVar35 + lVar66 * 4) = *(undefined1 *)(lVar73 + lVar66);
              *(undefined1 *)((long)pvVar35 + lVar66 * 4 + 1) = *(undefined1 *)(lVar73 + 1 + lVar66)
              ;
              *(undefined1 *)((long)pvVar35 + lVar66 * 4 + 2) = *(undefined1 *)(lVar86 + lVar66);
              *(undefined1 *)((long)pvVar35 + lVar66 * 4 + 3) = *(undefined1 *)(lVar86 + 1 + lVar66)
              ;
              *(undefined1 *)((long)pvVar35 + lVar66 * 4 + 4) = *(undefined1 *)(lVar46 + lVar66);
              *(undefined1 *)((long)pvVar35 + lVar66 * 4 + 5) = *(undefined1 *)(lVar46 + 1 + lVar66)
              ;
              *(undefined1 *)((long)pvVar35 + lVar66 * 4 + 6) = *(undefined1 *)(lVar57 + lVar66);
              *(undefined1 *)((long)pvVar35 + lVar66 * 4 + 7) = *(undefined1 *)(lVar57 + 1 + lVar66)
              ;
            }
            for (; (int)lVar66 < iVar76; lVar66 = lVar66 + 1) {
              *(undefined1 *)((long)pvVar35 + lVar66 * 4) = *(undefined1 *)(lVar73 + lVar66);
              *(undefined1 *)((long)pvVar35 + lVar66 * 4 + 1) = *(undefined1 *)(lVar86 + lVar66);
              *(undefined1 *)((long)pvVar35 + lVar66 * 4 + 2) = *(undefined1 *)(lVar46 + lVar66);
              *(undefined1 *)((long)pvVar35 + lVar66 * 4 + 3) = *(undefined1 *)(lVar57 + lVar66);
            }
            local_748 = local_748 + 4;
            local_740 = local_740 + 4;
            lVar84 = lVar84 + 4;
            uVar93 = uVar93 + 4;
          }
          for (uVar47 = (ulong)(int)(uVar62 & 0xfffffffc); pAVar32 = opt_q.workspace_allocator,
              (long)uVar47 < (long)(int)uVar62; uVar47 = uVar47 + 1) {
            lVar84 = CONCAT44(opt_q.num_threads,opt_q._0_4_);
            lVar73 = (long)(int)opt_q._44_4_;
            uVar93 = (ulong)(uint)((int)uVar47 >> 0x1f) << 0x20 | uVar47 & 0xffffffff;
            Mat::channel(&kernel_tm,&img,(int)((long)uVar93 % 4) + (int)((long)uVar93 / 4));
            pvVar35 = kernel_tm.data;
            Mat::~Mat(&kernel_tm);
            lVar84 = lVar84 + (long)pAVar32 * uVar47 * lVar73;
            for (lVar73 = 0; (int)lVar73 + 1 < iVar76; lVar73 = lVar73 + 2) {
              *(undefined1 *)((long)pvVar35 + lVar73) = *(undefined1 *)(lVar84 + lVar73);
              *(undefined1 *)((long)pvVar35 + lVar73 + 1) = *(undefined1 *)(lVar84 + 1 + lVar73);
            }
            for (; (int)lVar73 < iVar76; lVar73 = lVar73 + 1) {
              *(undefined1 *)((long)pvVar35 + lVar73) = *(undefined1 *)(lVar84 + lVar73);
            }
          }
          Mat::Mat(&kernel_tm,iVar52 * 4,iVar90,iVar72 / 4 + iVar72 % 4,1,opt->workspace_allocator);
          uVar93 = uVar99 & 0xfffffffffffffffc;
          uVar55 = 0;
          uVar47 = (ulong)(uint)(iVar72 >> 2);
          if (iVar72 >> 2 < 1) {
            uVar47 = uVar55;
          }
          iVar90 = iVar90 * iVar52;
          iVar69 = iVar90 * 4;
          iVar54 = iVar90 * 2;
          iVar70 = iVar90 * 3;
          local_738._0_4_ = iVar76;
          for (uVar64 = 0; uVar64 != uVar47; uVar64 = uVar64 + 1) {
            Mat::channel((Mat *)sum0,&kernel_tm,(int)uVar64);
            uVar21 = sum0._0_8_;
            lVar73 = (int)uVar55 + lVar77;
            lVar57 = (int)local_738._0_4_ + lVar77;
            lVar46 = iVar54 + lVar77;
            lVar86 = iVar70 + lVar77;
            Mat::~Mat((Mat *)sum0);
            for (lVar84 = 0; (int)lVar84 + 1 < iVar76; lVar84 = lVar84 + 2) {
              *(undefined1 *)(uVar21 + lVar84 * 4) = *(undefined1 *)(lVar73 + lVar84);
              *(undefined1 *)(uVar21 + 1 + lVar84 * 4) = *(undefined1 *)(lVar73 + 1 + lVar84);
              *(undefined1 *)(uVar21 + 2 + lVar84 * 4) = *(undefined1 *)(lVar57 + lVar84);
              *(undefined1 *)(uVar21 + 3 + lVar84 * 4) = *(undefined1 *)(lVar57 + 1 + lVar84);
              *(undefined1 *)(uVar21 + 4 + lVar84 * 4) = *(undefined1 *)(lVar46 + lVar84);
              *(undefined1 *)(uVar21 + 5 + lVar84 * 4) = *(undefined1 *)(lVar46 + 1 + lVar84);
              *(undefined1 *)(uVar21 + 6 + lVar84 * 4) = *(undefined1 *)(lVar86 + lVar84);
              *(undefined1 *)(uVar21 + 7 + lVar84 * 4) = *(undefined1 *)(lVar86 + 1 + lVar84);
            }
            for (; (int)lVar84 < iVar76; lVar84 = lVar84 + 1) {
              *(undefined1 *)(uVar21 + lVar84 * 4) = *(undefined1 *)(lVar73 + lVar84);
              *(undefined1 *)(uVar21 + 1 + lVar84 * 4) = *(undefined1 *)(lVar57 + lVar84);
              *(undefined1 *)(uVar21 + 2 + lVar84 * 4) = *(undefined1 *)(lVar46 + lVar84);
              *(undefined1 *)(uVar21 + 3 + lVar84 * 4) = *(undefined1 *)(lVar86 + lVar84);
            }
            uVar55 = (ulong)(uint)((int)uVar55 + iVar69);
            local_738._0_4_ = local_738._0_4_ + iVar69;
            iVar54 = iVar54 + iVar69;
            iVar70 = iVar70 + iVar69;
          }
          iVar70 = iVar90 * ((uint)(uVar99 >> 2) & 0x3fffffff) * 4;
          for (uVar55 = uVar93; (long)uVar55 < (long)uVar99; uVar55 = uVar55 + 1) {
            uVar64 = (ulong)(uint)((int)uVar55 >> 0x1f) << 0x20 | uVar55 & 0xffffffff;
            Mat::channel((Mat *)sum0,&kernel_tm,(int)((long)uVar64 % 4) + (int)((long)uVar64 / 4));
            uVar21 = sum0._0_8_;
            lVar73 = iVar70 + lVar77;
            Mat::~Mat((Mat *)sum0);
            for (lVar84 = 0; (int)lVar84 + 1 < iVar76; lVar84 = lVar84 + 2) {
              *(undefined1 *)(uVar21 + lVar84) = *(undefined1 *)(lVar73 + lVar84);
              *(undefined1 *)(uVar21 + 1 + lVar84) = *(undefined1 *)(lVar73 + 1 + lVar84);
            }
            for (; (int)lVar84 < iVar76; lVar84 = lVar84 + 1) {
              *(undefined1 *)(uVar21 + lVar84) = *(undefined1 *)(lVar73 + lVar84);
            }
            iVar70 = iVar70 + iVar76;
          }
          for (uVar55 = 0; uVar55 != uVar47; uVar55 = uVar55 + 1) {
            uVar64 = uVar55 * 4;
            if (lVar91 == 0) {
              uVar43 = 0;
              uVar83 = 0;
              uVar68 = 0;
              uVar97 = 0;
            }
            else {
              uVar68 = *(uint *)(lVar91 + uVar55 * 0x10);
              uVar97 = *(uint *)(lVar91 + 4 + uVar55 * 0x10);
              uVar83 = *(uint *)(lVar91 + 8 + uVar55 * 0x10);
              uVar43 = *(uint *)(lVar91 + 0xc + uVar55 * 0x10);
            }
            fVar1 = local_178._M_impl.super__Vector_impl_data._M_start[uVar55 * 4];
            fVar127 = local_178._M_impl.super__Vector_impl_data._M_start[uVar64 | 1];
            fVar2 = local_178._M_impl.super__Vector_impl_data._M_start[uVar64 | 2];
            fVar3 = local_178._M_impl.super__Vector_impl_data._M_start[uVar64 | 3];
            uVar63 = (uint)uVar64;
            Mat::channel((Mat *)sum0,top_blob,uVar63);
            puVar100 = (undefined4 *)sum0._0_8_;
            Mat::~Mat((Mat *)sum0);
            Mat::channel((Mat *)sum0,top_blob,uVar63 | 1);
            puVar95 = (undefined4 *)sum0._0_8_;
            Mat::~Mat((Mat *)sum0);
            Mat::channel((Mat *)sum0,top_blob,uVar63 | 2);
            puVar74 = (undefined4 *)sum0._0_8_;
            Mat::~Mat((Mat *)sum0);
            Mat::channel((Mat *)sum0,top_blob,(int)(uVar64 | 3));
            puVar59 = (undefined4 *)sum0._0_8_;
            Mat::~Mat((Mat *)sum0);
            for (uVar63 = 0; (int)(uVar63 | 3) < (int)uVar62; uVar63 = uVar63 + 4) {
              Mat::channel((Mat *)sum0,&img,uVar63 >> 2);
              lVar77 = sum0._0_8_;
              Mat::~Mat((Mat *)sum0);
              Mat::channel((Mat *)sum0,&kernel_tm,(int)uVar55);
              pcVar71 = (char *)sum0._0_8_;
              Mat::~Mat((Mat *)sum0);
              sum0[0] = 0;
              sum0[1] = 0;
              sum0[2] = 0;
              sum0[3] = 0;
              sum1[0] = 0;
              sum1[1] = 0;
              sum1[2] = 0;
              sum1[3] = 0;
              sum2 = (int  [4])ZEXT816(0);
              sum3[0] = 0;
              sum3[1] = 0;
              sum3[2] = 0;
              sum3[3] = 0;
              in_ZMM3 = ZEXT464(uVar97);
              for (uVar89 = 0; (int)(uVar89 | 1) < iVar76; uVar89 = uVar89 + 2) {
                cVar8 = *pcVar71;
                cVar9 = pcVar71[1];
                cVar10 = pcVar71[2];
                cVar11 = pcVar71[3];
                cVar12 = pcVar71[4];
                cVar13 = pcVar71[5];
                cVar14 = pcVar71[6];
                cVar15 = pcVar71[7];
                for (lVar84 = 0; lVar84 != 8; lVar84 = lVar84 + 2) {
                  iVar70 = (int)*(char *)(lVar77 + lVar84);
                  iVar54 = (int)*(char *)(lVar77 + 1 + lVar84);
                  *(int *)((long)sum0 + lVar84 * 2) =
                       iVar54 * cVar9 + iVar70 * cVar8 + *(int *)((long)sum0 + lVar84 * 2);
                  piVar30 = (int *)((long)sum2 + lVar84 * 2);
                  *piVar30 = *piVar30 + iVar54 * cVar13 + iVar70 * cVar12;
                  *(int *)((long)sum1 + lVar84 * 2) =
                       iVar54 * cVar11 + iVar70 * cVar10 + *(int *)((long)sum1 + lVar84 * 2);
                  piVar30 = (int *)((long)sum3 + lVar84 * 2);
                  *piVar30 = *piVar30 + iVar54 * cVar15 + iVar70 * cVar14;
                }
                pcVar71 = pcVar71 + 8;
                lVar77 = lVar77 + 8;
              }
              for (; (int)uVar89 < iVar76; uVar89 = uVar89 + 1) {
                cVar8 = *pcVar71;
                cVar9 = pcVar71[1];
                cVar10 = pcVar71[2];
                cVar11 = pcVar71[3];
                for (lVar84 = 0; lVar84 != 4; lVar84 = lVar84 + 1) {
                  iVar70 = (int)*(char *)(lVar77 + lVar84);
                  sum0[lVar84] = sum0[lVar84] + iVar70 * cVar8;
                  sum1[lVar84] = sum1[lVar84] + iVar70 * cVar9;
                  sum2[lVar84] = sum2[lVar84] + iVar70 * cVar10;
                  sum3[lVar84] = sum3[lVar84] + iVar70 * cVar11;
                }
                pcVar71 = pcVar71 + 4;
                lVar77 = lVar77 + 4;
              }
              for (lVar77 = 0; lVar77 != 0x10; lVar77 = lVar77 + 4) {
                auVar124._0_4_ = (float)*(int *)((long)sum0 + lVar77);
                auVar133 = in_ZMM9._4_12_;
                auVar124._4_12_ = auVar133;
                auVar124 = vfmadd213ss_fma(auVar124,ZEXT416((uint)fVar1),ZEXT416(uVar68));
                *(int *)((long)puVar100 + lVar77) = auVar124._0_4_;
                auVar106._0_4_ = (float)*(int *)((long)sum1 + lVar77);
                auVar106._4_12_ = auVar133;
                auVar124 = vfmadd213ss_fma(auVar106,ZEXT416((uint)fVar127),ZEXT416(uVar97));
                *(int *)((long)puVar95 + lVar77) = auVar124._0_4_;
                auVar107._0_4_ = (float)*(int *)((long)sum2 + lVar77);
                auVar107._4_12_ = auVar133;
                auVar124 = vfmadd213ss_fma(auVar107,ZEXT416((uint)fVar2),ZEXT416(uVar83));
                *(int *)((long)puVar74 + lVar77) = auVar124._0_4_;
                auVar108._0_4_ = (float)*(int *)((long)sum3 + lVar77);
                auVar108._4_12_ = auVar133;
                auVar124 = vfmadd213ss_fma(auVar108,ZEXT416((uint)fVar3),ZEXT416(uVar43));
                *(int *)((long)puVar59 + lVar77) = auVar124._0_4_;
              }
              puVar100 = puVar100 + 4;
              puVar95 = puVar95 + 4;
              puVar74 = puVar74 + 4;
              puVar59 = puVar59 + 4;
            }
            for (; (int)uVar63 < (int)uVar62; uVar63 = uVar63 + 1) {
              Mat::channel((Mat *)sum0,&img,(uVar63 & 3) + (uVar63 >> 2));
              uVar21 = sum0._0_8_;
              Mat::~Mat((Mat *)sum0);
              Mat::channel((Mat *)sum0,&kernel_tm,(int)uVar55);
              uVar34 = sum0._0_8_;
              Mat::~Mat((Mat *)sum0);
              iVar79 = 0;
              iVar69 = 0;
              iVar54 = 0;
              iVar70 = 0;
              in_ZMM3 = ZEXT464(uVar97);
              pcVar71 = (char *)uVar34;
              for (lVar77 = 0; (int)lVar77 + 1 < iVar76; lVar77 = lVar77 + 2) {
                iVar67 = (int)*(char *)(uVar21 + lVar77);
                iVar72 = (int)*(char *)(uVar21 + 1 + lVar77);
                iVar79 = pcVar71[1] * iVar72 + *pcVar71 * iVar67 + iVar79;
                iVar69 = pcVar71[3] * iVar72 + pcVar71[2] * iVar67 + iVar69;
                iVar54 = pcVar71[5] * iVar72 + pcVar71[4] * iVar67 + iVar54;
                iVar70 = pcVar71[7] * iVar72 + pcVar71[6] * iVar67 + iVar70;
                pcVar71 = pcVar71 + 8;
              }
              for (; (int)lVar77 < iVar76; lVar77 = lVar77 + 1) {
                iVar67 = (int)*(char *)(uVar21 + lVar77);
                iVar79 = iVar79 + *(char *)(uVar34 + lVar77 * 4) * iVar67;
                iVar69 = iVar69 + *(char *)(uVar34 + 1 + lVar77 * 4) * iVar67;
                iVar54 = iVar54 + *(char *)(uVar34 + 2 + lVar77 * 4) * iVar67;
                iVar70 = iVar70 + *(char *)(uVar34 + 3 + lVar77 * 4) * iVar67;
              }
              auVar109._0_4_ = (float)iVar79;
              auVar133 = in_ZMM9._4_12_;
              auVar109._4_12_ = auVar133;
              auVar124 = vfmadd213ss_fma(auVar109,ZEXT416((uint)fVar1),ZEXT416(uVar68));
              *puVar100 = auVar124._0_4_;
              auVar110._0_4_ = (float)iVar69;
              auVar110._4_12_ = auVar133;
              auVar124 = vfmadd213ss_fma(auVar110,ZEXT416((uint)fVar127),ZEXT416(uVar97));
              *puVar95 = auVar124._0_4_;
              auVar111._0_4_ = (float)iVar54;
              auVar111._4_12_ = auVar133;
              auVar124 = vfmadd213ss_fma(auVar111,ZEXT416((uint)fVar2),ZEXT416(uVar83));
              auVar130._0_4_ = (float)iVar70;
              auVar130._4_12_ = auVar133;
              *puVar74 = auVar124._0_4_;
              auVar124 = vfmadd213ss_fma(auVar130,ZEXT416((uint)fVar3),ZEXT416(uVar43));
              *puVar59 = auVar124._0_4_;
              puVar100 = puVar100 + 1;
              puVar95 = puVar95 + 1;
              puVar74 = puVar74 + 1;
              puVar59 = puVar59 + 1;
            }
          }
          iVar70 = 0;
          if (0 < iVar76) {
            iVar70 = iVar76;
          }
          for (; (long)uVar93 < (long)uVar99; uVar93 = uVar93 + 1) {
            iVar54 = (int)uVar93;
            Mat::channel((Mat *)sum0,top_blob,iVar54);
            puVar100 = (undefined4 *)sum0._0_8_;
            Mat::~Mat((Mat *)sum0);
            if (lVar91 == 0) {
              uVar68 = 0;
            }
            else {
              uVar68 = *(uint *)(lVar91 + uVar93 * 4);
            }
            fVar1 = local_178._M_impl.super__Vector_impl_data._M_start[uVar93];
            iVar54 = (int)((long)((ulong)(uint)(iVar54 >> 0x1f) << 0x20 | uVar93 & 0xffffffff) / 4)
                     * -3 + iVar54;
            for (uVar47 = 0; (int)((uint)uVar47 | 3) < (int)uVar62;
                uVar47 = (ulong)((uint)uVar47 + 4)) {
              Mat::channel((Mat *)sum0,&img,(int)(uVar47 >> 2));
              lVar77 = sum0._0_8_;
              Mat::~Mat((Mat *)sum0);
              Mat::channel((Mat *)sum0,&kernel_tm,iVar54);
              pcVar71 = (char *)sum0._0_8_;
              Mat::~Mat((Mat *)sum0);
              sum0[0] = 0;
              sum0[1] = 0;
              sum0[2] = 0;
              sum0[3] = 0;
              for (uVar97 = 0; (int)(uVar97 | 1) < iVar76; uVar97 = uVar97 + 2) {
                cVar8 = *pcVar71;
                cVar9 = pcVar71[1];
                for (lVar84 = 0; lVar84 != 4; lVar84 = lVar84 + 1) {
                  sum0[lVar84] = (int)*(char *)(lVar77 + 1 + lVar84 * 2) * (int)cVar9 +
                                 (int)*(char *)(lVar77 + lVar84 * 2) * (int)cVar8 + sum0[lVar84];
                }
                pcVar71 = pcVar71 + 2;
                lVar77 = lVar77 + 8;
              }
              for (; (int)uVar97 < iVar76; uVar97 = uVar97 + 1) {
                cVar8 = *pcVar71;
                for (lVar84 = 0; lVar84 != 4; lVar84 = lVar84 + 1) {
                  sum0[lVar84] = sum0[lVar84] + (int)*(char *)(lVar77 + lVar84) * (int)cVar8;
                }
                pcVar71 = pcVar71 + 1;
                lVar77 = lVar77 + 4;
              }
              for (lVar77 = 0; lVar77 != 4; lVar77 = lVar77 + 1) {
                auVar120._0_4_ = (float)sum0[lVar77];
                auVar120._4_12_ = in_ZMM3._4_12_;
                auVar124 = vfmadd213ss_fma(auVar120,ZEXT416((uint)fVar1),ZEXT416(uVar68));
                puVar100[lVar77] = auVar124._0_4_;
              }
              puVar100 = puVar100 + 4;
            }
            while (uVar97 = (uint)uVar47, (int)uVar97 < (int)uVar62) {
              Mat::channel((Mat *)sum0,&img,(uVar97 & 3) + (int)(uVar47 >> 2));
              uVar21 = sum0._0_8_;
              Mat::~Mat((Mat *)sum0);
              Mat::channel((Mat *)sum0,&kernel_tm,iVar54);
              uVar34 = sum0._0_8_;
              Mat::~Mat((Mat *)sum0);
              iVar69 = 0;
              for (lVar77 = 0; iVar70 != (int)lVar77; lVar77 = lVar77 + 1) {
                iVar69 = iVar69 + (int)*(char *)(uVar21 + lVar77) * (int)*(char *)(uVar34 + lVar77);
              }
              auVar121._0_4_ = (float)iVar69;
              auVar121._4_12_ = in_ZMM3._4_12_;
              auVar124 = vfmadd213ss_fma(auVar121,ZEXT416((uint)fVar1),ZEXT416(uVar68));
              *puVar100 = auVar124._0_4_;
              puVar100 = puVar100 + 1;
              uVar47 = (ulong)(uVar97 + 1);
            }
          }
          Mat::~Mat(&kernel_tm);
          Mat::~Mat(&img);
          Mat::~Mat((Mat *)&opt_q);
          this_01 = &local_178;
        }
        else {
          requantize_scales.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          requantize_scales.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          requantize_scales.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          for (lVar77 = 0; p_Var18 = pp_Var48[-3],
              lVar77 < *(int *)(p_Var18 + 0x30 + (long)&(this->weight_data_3x3_winograd63).data);
              lVar77 = lVar77 + 1) {
            fVar1 = *(float *)(*(long *)(&this->field_0x1f0 + (long)p_Var18) + lVar77 * 4);
            opt_q._0_4_ = 0.0;
            if (fVar1 != 0.0) {
              opt_q._0_4_ = 1.0 / (fVar1 * **(float **)(&this->field_0x238 + (long)p_Var18));
            }
            img.data._0_4_ = **(undefined4 **)(&this->field_0x280 + (long)p_Var18);
            std::vector<float,_std::allocator<float>_>::push_back
                      (&requantize_scales,(value_type_conflict4 *)&opt_q);
            std::vector<float,_std::allocator<float>_>::push_back
                      (&requantize_scales,(value_type_conflict4 *)&img);
            pp_Var48 = this->_vptr_Convolution_x86_avx2;
          }
          uVar68 = *(uint *)(p_Var18 + 0x34 + (long)&(this->weight_data_3x3_winograd63).data);
          iVar70 = *(int *)(p_Var18 + 0x38 + (long)&(this->weight_data_3x3_winograd63).data);
          iVar54 = *(int *)(p_Var18 + 0x44 + (long)&(this->weight_data_3x3_winograd63).data);
          iVar69 = *(int *)((long)&this->convolution_dilation1 + (long)p_Var18);
          std::vector<float,_std::allocator<float>_>::vector
                    ((vector<float,_std::allocator<float>_> *)&local_160,&requantize_scales);
          iVar90 = bottom_blob_bordered.c;
          iVar101 = bottom_blob_bordered.w;
          iVar79 = top_blob->w;
          iVar67 = top_blob->h;
          iVar72 = top_blob->c;
          uVar99 = (ulong)iVar72;
          lVar77 = *(long *)(p_Var18 + 0x28 + (long)&(this->weight_data_3x3_winograd23_int8).data);
          lVar91 = *(long *)(&this->field_0x1a8 + (long)p_Var18);
          iVar52 = iVar70 * uVar68;
          iVar76 = bottom_blob_bordered.c * iVar52;
          uVar62 = iVar67 * iVar79;
          Mat::Mat((Mat *)&opt_q,iVar76,uVar62,1,opt->workspace_allocator);
          if ((int)uVar68 < 1) {
            uVar68 = 0;
          }
          if (iVar70 < 1) {
            iVar70 = 0;
          }
          iVar49 = 0;
          if (0 < iVar90) {
            iVar49 = iVar90;
          }
          lVar84 = CONCAT44(opt_q.num_threads,opt_q._0_4_);
          if (iVar79 < 1) {
            iVar79 = 0;
          }
          iVar45 = 0;
          if (iVar67 < 1) {
            iVar67 = 0;
          }
          iVar98 = 0;
          for (iVar53 = 0; iVar53 != iVar67; iVar53 = iVar53 + 1) {
            iVar51 = iVar45;
            for (iVar44 = 0; iVar44 != iVar79; iVar44 = iVar44 + 1) {
              for (iVar50 = 0; iVar50 != iVar49; iVar50 = iVar50 + 1) {
                Mat::channel(&img,&bottom_blob_bordered,iVar50);
                lVar73 = CONCAT44(img.data._4_4_,img.data._0_4_);
                Mat::~Mat(&img);
                iVar75 = iVar51;
                for (iVar61 = 0; iVar61 != iVar70; iVar61 = iVar61 + 1) {
                  for (uVar47 = 0; uVar68 != uVar47; uVar47 = uVar47 + 1) {
                    *(undefined1 *)(iVar98 + lVar84 + uVar47) =
                         *(undefined1 *)(lVar73 + (iVar75 + (int)uVar47));
                  }
                  iVar98 = iVar98 + (int)uVar47;
                  iVar75 = iVar75 + iVar101;
                }
              }
              iVar51 = iVar51 + iVar54;
            }
            iVar45 = iVar45 + iVar69 * iVar101;
          }
          lVar84 = 1;
          Mat::Mat(&img,iVar52 * 4,iVar90,((int)uVar62 / 4) * -3 + uVar62,1,opt->workspace_allocator
                  );
          uVar93 = 0;
          uVar47 = (ulong)(uint)((int)uVar62 >> 2);
          if ((int)uVar62 >> 2 < 1) {
            uVar47 = uVar93;
          }
          lVar73 = 3;
          lVar46 = 2;
          for (uVar55 = 0; pAVar32 = opt_q.workspace_allocator, uVar55 != uVar47;
              uVar55 = uVar55 + 1) {
            lVar57 = CONCAT44(opt_q.num_threads,opt_q._0_4_);
            lVar81 = (long)(int)opt_q._44_4_;
            Mat::channel(&kernel_tm,&img,(int)uVar55);
            pvVar35 = kernel_tm.data;
            Mat::~Mat(&kernel_tm);
            lVar86 = (long)pAVar32 * lVar73 * lVar81 + lVar57;
            lVar66 = (long)pAVar32 * lVar46 * lVar81 + lVar57;
            lVar78 = (long)pAVar32 * lVar84 * lVar81 + lVar57;
            lVar57 = (long)pAVar32 * uVar93 * lVar81 + lVar57;
            for (lVar81 = 0; (int)lVar81 + 1 < iVar76; lVar81 = lVar81 + 2) {
              *(undefined1 *)((long)pvVar35 + lVar81 * 4) = *(undefined1 *)(lVar57 + lVar81);
              *(undefined1 *)((long)pvVar35 + lVar81 * 4 + 1) = *(undefined1 *)(lVar57 + 1 + lVar81)
              ;
              *(undefined1 *)((long)pvVar35 + lVar81 * 4 + 2) = *(undefined1 *)(lVar78 + lVar81);
              *(undefined1 *)((long)pvVar35 + lVar81 * 4 + 3) = *(undefined1 *)(lVar78 + 1 + lVar81)
              ;
              *(undefined1 *)((long)pvVar35 + lVar81 * 4 + 4) = *(undefined1 *)(lVar66 + lVar81);
              *(undefined1 *)((long)pvVar35 + lVar81 * 4 + 5) = *(undefined1 *)(lVar66 + 1 + lVar81)
              ;
              *(undefined1 *)((long)pvVar35 + lVar81 * 4 + 6) = *(undefined1 *)(lVar86 + lVar81);
              *(undefined1 *)((long)pvVar35 + lVar81 * 4 + 7) = *(undefined1 *)(lVar86 + 1 + lVar81)
              ;
            }
            for (; (int)lVar81 < iVar76; lVar81 = lVar81 + 1) {
              *(undefined1 *)((long)pvVar35 + lVar81 * 4) = *(undefined1 *)(lVar57 + lVar81);
              *(undefined1 *)((long)pvVar35 + lVar81 * 4 + 1) = *(undefined1 *)(lVar78 + lVar81);
              *(undefined1 *)((long)pvVar35 + lVar81 * 4 + 2) = *(undefined1 *)(lVar66 + lVar81);
              *(undefined1 *)((long)pvVar35 + lVar81 * 4 + 3) = *(undefined1 *)(lVar86 + lVar81);
            }
            lVar73 = lVar73 + 4;
            lVar46 = lVar46 + 4;
            lVar84 = lVar84 + 4;
            uVar93 = uVar93 + 4;
          }
          for (uVar47 = (ulong)(int)(uVar62 & 0xfffffffc); pAVar32 = opt_q.workspace_allocator,
              (long)uVar47 < (long)(int)uVar62; uVar47 = uVar47 + 1) {
            lVar84 = CONCAT44(opt_q.num_threads,opt_q._0_4_);
            lVar73 = (long)(int)opt_q._44_4_;
            uVar93 = (ulong)(uint)((int)uVar47 >> 0x1f) << 0x20 | uVar47 & 0xffffffff;
            Mat::channel(&kernel_tm,&img,(int)((long)uVar93 % 4) + (int)((long)uVar93 / 4));
            pvVar35 = kernel_tm.data;
            Mat::~Mat(&kernel_tm);
            lVar84 = lVar84 + (long)pAVar32 * uVar47 * lVar73;
            for (lVar73 = 0; (int)lVar73 + 1 < iVar76; lVar73 = lVar73 + 2) {
              *(undefined1 *)((long)pvVar35 + lVar73) = *(undefined1 *)(lVar84 + lVar73);
              *(undefined1 *)((long)pvVar35 + lVar73 + 1) = *(undefined1 *)(lVar84 + 1 + lVar73);
            }
            for (; (int)lVar73 < iVar76; lVar73 = lVar73 + 1) {
              *(undefined1 *)((long)pvVar35 + lVar73) = *(undefined1 *)(lVar84 + lVar73);
            }
          }
          Mat::Mat(&kernel_tm,iVar52 * 4,iVar90,iVar72 / 4 + iVar72 % 4,1,opt->workspace_allocator);
          uVar93 = uVar99 & 0xfffffffffffffffc;
          uVar55 = 0;
          uVar47 = (ulong)(uint)(iVar72 >> 2);
          if (iVar72 >> 2 < 1) {
            uVar47 = uVar55;
          }
          iVar90 = iVar90 * iVar52;
          iVar54 = iVar90 * 4;
          local_738._0_4_ = iVar90 * 2;
          local_708._0_4_ = iVar90 * 3;
          iVar70 = iVar76;
          for (uVar64 = 0; uVar64 != uVar47; uVar64 = uVar64 + 1) {
            Mat::channel((Mat *)sum0,&kernel_tm,(int)uVar64);
            uVar21 = sum0._0_8_;
            lVar73 = (int)uVar55 + lVar77;
            lVar57 = iVar70 + lVar77;
            lVar46 = (int)local_738._0_4_ + lVar77;
            lVar86 = (int)local_708._0_4_ + lVar77;
            Mat::~Mat((Mat *)sum0);
            for (lVar84 = 0; (int)lVar84 + 1 < iVar76; lVar84 = lVar84 + 2) {
              *(undefined1 *)(uVar21 + lVar84 * 4) = *(undefined1 *)(lVar73 + lVar84);
              *(undefined1 *)(uVar21 + 1 + lVar84 * 4) = *(undefined1 *)(lVar73 + 1 + lVar84);
              *(undefined1 *)(uVar21 + 2 + lVar84 * 4) = *(undefined1 *)(lVar57 + lVar84);
              *(undefined1 *)(uVar21 + 3 + lVar84 * 4) = *(undefined1 *)(lVar57 + 1 + lVar84);
              *(undefined1 *)(uVar21 + 4 + lVar84 * 4) = *(undefined1 *)(lVar46 + lVar84);
              *(undefined1 *)(uVar21 + 5 + lVar84 * 4) = *(undefined1 *)(lVar46 + 1 + lVar84);
              *(undefined1 *)(uVar21 + 6 + lVar84 * 4) = *(undefined1 *)(lVar86 + lVar84);
              *(undefined1 *)(uVar21 + 7 + lVar84 * 4) = *(undefined1 *)(lVar86 + 1 + lVar84);
            }
            for (; (int)lVar84 < iVar76; lVar84 = lVar84 + 1) {
              *(undefined1 *)(uVar21 + lVar84 * 4) = *(undefined1 *)(lVar73 + lVar84);
              *(undefined1 *)(uVar21 + 1 + lVar84 * 4) = *(undefined1 *)(lVar57 + lVar84);
              *(undefined1 *)(uVar21 + 2 + lVar84 * 4) = *(undefined1 *)(lVar46 + lVar84);
              *(undefined1 *)(uVar21 + 3 + lVar84 * 4) = *(undefined1 *)(lVar86 + lVar84);
            }
            uVar55 = (ulong)(uint)((int)uVar55 + iVar54);
            iVar70 = iVar70 + iVar54;
            local_738._0_4_ = local_738._0_4_ + iVar54;
            local_708._0_4_ = local_708._0_4_ + iVar54;
          }
          iVar70 = iVar90 * ((uint)(uVar99 >> 2) & 0x3fffffff) * 4;
          for (uVar55 = uVar93; (long)uVar55 < (long)uVar99; uVar55 = uVar55 + 1) {
            uVar64 = (ulong)(uint)((int)uVar55 >> 0x1f) << 0x20 | uVar55 & 0xffffffff;
            Mat::channel((Mat *)sum0,&kernel_tm,(int)((long)uVar64 % 4) + (int)((long)uVar64 / 4));
            uVar21 = sum0._0_8_;
            lVar73 = iVar70 + lVar77;
            Mat::~Mat((Mat *)sum0);
            for (lVar84 = 0; (int)lVar84 + 1 < iVar76; lVar84 = lVar84 + 2) {
              *(undefined1 *)(uVar21 + lVar84) = *(undefined1 *)(lVar73 + lVar84);
              *(undefined1 *)(uVar21 + 1 + lVar84) = *(undefined1 *)(lVar73 + 1 + lVar84);
            }
            for (; (int)lVar84 < iVar76; lVar84 = lVar84 + 1) {
              *(undefined1 *)(uVar21 + lVar84) = *(undefined1 *)(lVar73 + lVar84);
            }
            iVar70 = iVar70 + iVar76;
          }
          for (uVar55 = 0; uVar55 != uVar47; uVar55 = uVar55 + 1) {
            uVar64 = uVar55 * 4;
            Mat::channel((Mat *)sum0,top_blob,(uint)uVar64);
            puVar92 = (undefined1 *)sum0._0_8_;
            Mat::~Mat((Mat *)sum0);
            uVar56 = uVar64 | 1;
            Mat::channel((Mat *)sum0,top_blob,(int)uVar56);
            puVar87 = (undefined1 *)sum0._0_8_;
            Mat::~Mat((Mat *)sum0);
            uVar65 = uVar64 | 2;
            Mat::channel((Mat *)sum0,top_blob,(int)uVar65);
            puVar88 = (undefined1 *)sum0._0_8_;
            Mat::~Mat((Mat *)sum0);
            uVar96 = uVar64 | 3;
            Mat::channel((Mat *)sum0,top_blob,(uint)uVar64 | 3);
            puVar80 = (undefined1 *)sum0._0_8_;
            Mat::~Mat((Mat *)sum0);
            if (lVar91 == 0) {
              uVar83 = 0;
              uVar68 = 0;
              uVar97 = 0;
              uVar43 = 0;
            }
            else {
              uVar68 = *(uint *)(lVar91 + uVar55 * 0x10);
              uVar97 = *(uint *)(lVar91 + uVar56 * 4);
              uVar83 = *(uint *)(lVar91 + uVar65 * 4);
              uVar43 = *(uint *)(lVar91 + uVar96 * 4);
            }
            fVar1 = local_160._M_impl.super__Vector_impl_data._M_start[uVar55 * 8];
            fVar127 = local_160._M_impl.super__Vector_impl_data._M_start[uVar55 * 8 + 1];
            fVar2 = local_160._M_impl.super__Vector_impl_data._M_start[uVar56 * 2];
            fVar3 = local_160._M_impl.super__Vector_impl_data._M_start[uVar56 * 2 + 1];
            fVar4 = local_160._M_impl.super__Vector_impl_data._M_start[uVar65 * 2];
            fVar5 = local_160._M_impl.super__Vector_impl_data._M_start[uVar65 * 2 + 1];
            fVar6 = local_160._M_impl.super__Vector_impl_data._M_start[uVar96 * 2];
            fVar7 = local_160._M_impl.super__Vector_impl_data._M_start[uVar96 * 2 + 1];
            uVar63 = 0;
            while( true ) {
              if ((int)uVar62 <= (int)(uVar63 | 3)) break;
              Mat::channel((Mat *)sum0,&img,uVar63 >> 2);
              lVar77 = sum0._0_8_;
              Mat::~Mat((Mat *)sum0);
              Mat::channel((Mat *)sum0,&kernel_tm,(int)uVar55);
              pcVar71 = (char *)sum0._0_8_;
              Mat::~Mat((Mat *)sum0);
              sum0[0] = 0;
              sum0[1] = 0;
              sum0[2] = 0;
              sum0[3] = 0;
              sum1[0] = 0;
              sum1[1] = 0;
              sum1[2] = 0;
              sum1[3] = 0;
              sum2 = (int  [4])ZEXT816(0);
              sum3[0] = 0;
              sum3[1] = 0;
              sum3[2] = 0;
              sum3[3] = 0;
              auVar131._8_4_ = 0x80000000;
              auVar131._0_8_ = 0x8000000080000000;
              auVar131._12_4_ = 0x80000000;
              auVar134._8_4_ = 0x3effffff;
              auVar134._0_8_ = 0x3effffff3effffff;
              auVar134._12_4_ = 0x3effffff;
              in_ZMM5 = ZEXT464(uVar68);
              in_ZMM15 = ZEXT464((uint)fVar7);
              for (uVar89 = 0; (int)(uVar89 | 1) < iVar76; uVar89 = uVar89 + 2) {
                cVar8 = *pcVar71;
                cVar9 = pcVar71[1];
                cVar10 = pcVar71[2];
                cVar11 = pcVar71[3];
                cVar12 = pcVar71[4];
                cVar13 = pcVar71[5];
                cVar14 = pcVar71[6];
                cVar15 = pcVar71[7];
                for (lVar84 = 0; lVar84 != 8; lVar84 = lVar84 + 2) {
                  iVar70 = (int)*(char *)(lVar77 + lVar84);
                  iVar54 = (int)*(char *)(lVar77 + 1 + lVar84);
                  *(int *)((long)sum0 + lVar84 * 2) =
                       iVar54 * cVar9 + iVar70 * cVar8 + *(int *)((long)sum0 + lVar84 * 2);
                  piVar30 = (int *)((long)sum2 + lVar84 * 2);
                  *piVar30 = *piVar30 + iVar54 * cVar13 + iVar70 * cVar12;
                  *(int *)((long)sum1 + lVar84 * 2) =
                       iVar54 * cVar11 + iVar70 * cVar10 + *(int *)((long)sum1 + lVar84 * 2);
                  piVar30 = (int *)((long)sum3 + lVar84 * 2);
                  *piVar30 = *piVar30 + iVar54 * cVar15 + iVar70 * cVar14;
                }
                pcVar71 = pcVar71 + 8;
                lVar77 = lVar77 + 8;
              }
              for (; (int)uVar89 < iVar76; uVar89 = uVar89 + 1) {
                cVar8 = *pcVar71;
                cVar9 = pcVar71[1];
                cVar10 = pcVar71[2];
                cVar11 = pcVar71[3];
                for (lVar84 = 0; lVar84 != 4; lVar84 = lVar84 + 1) {
                  iVar70 = (int)*(char *)(lVar77 + lVar84);
                  sum0[lVar84] = sum0[lVar84] + iVar70 * cVar8;
                  sum1[lVar84] = sum1[lVar84] + iVar70 * cVar9;
                  sum2[lVar84] = sum2[lVar84] + iVar70 * cVar10;
                  sum3[lVar84] = sum3[lVar84] + iVar70 * cVar11;
                }
                pcVar71 = pcVar71 + 4;
                lVar77 = lVar77 + 4;
              }
              for (lVar77 = 0; lVar77 != 4; lVar77 = lVar77 + 1) {
                auVar112._0_4_ = (float)sum0[lVar77];
                auVar133 = auVar131._4_12_;
                auVar112._4_12_ = auVar133;
                auVar124 = vfmadd213ss_fma(auVar112,ZEXT416((uint)fVar1),ZEXT416(uVar68));
                fVar20 = fVar127 * auVar124._0_4_;
                auVar124 = vandps_avx(ZEXT416((uint)fVar20),auVar131);
                auVar124 = vorps_avx(auVar124,auVar134);
                auVar124 = ZEXT416((uint)(fVar20 + auVar124._0_4_));
                auVar124 = vroundss_avx(auVar124,auVar124,0xb);
                iVar54 = -0x7f;
                iVar70 = (int)auVar124._0_4_;
                if ((int)auVar124._0_4_ < -0x7e) {
                  iVar70 = iVar54;
                }
                iVar69 = 0x7f;
                if (0x7e < iVar70) {
                  iVar70 = iVar69;
                }
                puVar92[lVar77] = (char)iVar70;
                auVar113._0_4_ = (float)sum1[lVar77];
                auVar113._4_12_ = auVar133;
                auVar124 = vfmadd213ss_fma(auVar113,ZEXT416((uint)fVar2),ZEXT416(uVar97));
                fVar20 = fVar3 * auVar124._0_4_;
                auVar124 = vandps_avx(ZEXT416((uint)fVar20),auVar131);
                auVar124 = vorps_avx(auVar124,auVar134);
                auVar124 = ZEXT416((uint)(fVar20 + auVar124._0_4_));
                auVar124 = vroundss_avx(auVar124,auVar124,0xb);
                iVar70 = (int)auVar124._0_4_;
                if ((int)auVar124._0_4_ < -0x7e) {
                  iVar70 = iVar54;
                }
                if (0x7e < iVar70) {
                  iVar70 = iVar69;
                }
                puVar87[lVar77] = (char)iVar70;
                auVar114._0_4_ = (float)sum2[lVar77];
                auVar114._4_12_ = auVar133;
                auVar124 = vfmadd213ss_fma(auVar114,ZEXT416((uint)fVar4),ZEXT416(uVar83));
                fVar20 = fVar5 * auVar124._0_4_;
                auVar124 = vandps_avx(ZEXT416((uint)fVar20),auVar131);
                auVar124 = vorps_avx(auVar124,auVar134);
                auVar124 = ZEXT416((uint)(fVar20 + auVar124._0_4_));
                auVar124 = vroundss_avx(auVar124,auVar124,0xb);
                iVar70 = (int)auVar124._0_4_;
                if ((int)auVar124._0_4_ < -0x7e) {
                  iVar70 = iVar54;
                }
                if (0x7e < iVar70) {
                  iVar70 = iVar69;
                }
                puVar88[lVar77] = (char)iVar70;
                auVar115._0_4_ = (float)sum3[lVar77];
                auVar115._4_12_ = auVar133;
                auVar124 = vfmadd213ss_fma(auVar115,ZEXT416((uint)fVar6),ZEXT416(uVar43));
                fVar20 = fVar7 * auVar124._0_4_;
                auVar124 = vandps_avx(ZEXT416((uint)fVar20),auVar131);
                auVar124 = vorps_avx(auVar124,auVar134);
                auVar124 = ZEXT416((uint)(fVar20 + auVar124._0_4_));
                auVar124 = vroundss_avx(auVar124,auVar124,0xb);
                iVar70 = (int)auVar124._0_4_;
                if (iVar70 < -0x7e) {
                  iVar70 = -0x7f;
                }
                if (0x7e < iVar70) {
                  iVar70 = 0x7f;
                }
                puVar80[lVar77] = (char)iVar70;
              }
              puVar92 = puVar92 + 4;
              puVar87 = puVar87 + 4;
              puVar88 = puVar88 + 4;
              puVar80 = puVar80 + 4;
              uVar63 = uVar63 + 4;
            }
            for (; (int)uVar63 < (int)uVar62; uVar63 = uVar63 + 1) {
              Mat::channel((Mat *)sum0,&img,(uVar63 & 3) + (uVar63 >> 2));
              uVar21 = sum0._0_8_;
              Mat::~Mat((Mat *)sum0);
              Mat::channel((Mat *)sum0,&kernel_tm,(int)uVar55);
              uVar34 = sum0._0_8_;
              Mat::~Mat((Mat *)sum0);
              iVar79 = 0;
              iVar69 = 0;
              iVar54 = 0;
              iVar70 = 0;
              auVar132._8_4_ = 0x80000000;
              auVar132._0_8_ = 0x8000000080000000;
              auVar132._12_4_ = 0x80000000;
              auVar135._8_4_ = 0x3effffff;
              auVar135._0_8_ = 0x3effffff3effffff;
              auVar135._12_4_ = 0x3effffff;
              in_ZMM5 = ZEXT464(uVar97);
              pcVar71 = (char *)uVar34;
              for (lVar77 = 0; (int)lVar77 + 1 < iVar76; lVar77 = lVar77 + 2) {
                iVar67 = (int)*(char *)(uVar21 + lVar77);
                iVar72 = (int)*(char *)(uVar21 + 1 + lVar77);
                iVar79 = pcVar71[1] * iVar72 + *pcVar71 * iVar67 + iVar79;
                iVar69 = pcVar71[3] * iVar72 + pcVar71[2] * iVar67 + iVar69;
                iVar54 = pcVar71[5] * iVar72 + pcVar71[4] * iVar67 + iVar54;
                iVar70 = pcVar71[7] * iVar72 + pcVar71[6] * iVar67 + iVar70;
                pcVar71 = pcVar71 + 8;
              }
              for (; (int)lVar77 < iVar76; lVar77 = lVar77 + 1) {
                iVar67 = (int)*(char *)(uVar21 + lVar77);
                iVar79 = iVar79 + *(char *)(uVar34 + lVar77 * 4) * iVar67;
                iVar69 = iVar69 + *(char *)(uVar34 + 1 + lVar77 * 4) * iVar67;
                iVar54 = iVar54 + *(char *)(uVar34 + 2 + lVar77 * 4) * iVar67;
                iVar70 = iVar70 + *(char *)(uVar34 + 3 + lVar77 * 4) * iVar67;
              }
              auVar116._0_4_ = (float)iVar79;
              auVar133 = in_ZMM15._4_12_;
              auVar116._4_12_ = auVar133;
              auVar124 = vfmadd213ss_fma(auVar116,ZEXT416((uint)fVar1),ZEXT416(uVar68));
              fVar20 = fVar127 * auVar124._0_4_;
              auVar124 = vandps_avx(ZEXT416((uint)fVar20),auVar132);
              auVar124 = vorps_avx(auVar124,auVar135);
              auVar124 = ZEXT416((uint)(fVar20 + auVar124._0_4_));
              auVar124 = vroundss_avx(auVar124,auVar124,0xb);
              iVar79 = (int)auVar124._0_4_;
              if ((int)auVar124._0_4_ < -0x7e) {
                iVar79 = -0x7f;
              }
              uVar42 = (undefined1)iVar79;
              if (0x7e < iVar79) {
                uVar42 = 0x7f;
              }
              auVar117._0_4_ = (float)iVar69;
              auVar117._4_12_ = auVar133;
              auVar124 = vfmadd213ss_fma(auVar117,ZEXT416((uint)fVar2),ZEXT416(uVar97));
              fVar20 = fVar3 * auVar124._0_4_;
              auVar124 = vandps_avx(ZEXT416((uint)fVar20),auVar132);
              auVar124 = vorps_avx(auVar124,auVar135);
              auVar124 = ZEXT416((uint)(fVar20 + auVar124._0_4_));
              auVar124 = vroundss_avx(auVar124,auVar124,0xb);
              iVar69 = (int)auVar124._0_4_;
              if ((int)auVar124._0_4_ < -0x7e) {
                iVar69 = -0x7f;
              }
              uVar60 = (undefined1)iVar69;
              if (0x7e < iVar69) {
                uVar60 = 0x7f;
              }
              auVar118._0_4_ = (float)iVar54;
              auVar118._4_12_ = auVar133;
              auVar124 = vfmadd213ss_fma(auVar118,ZEXT416((uint)fVar4),ZEXT416(uVar83));
              fVar20 = fVar5 * auVar124._0_4_;
              auVar124 = vandps_avx(ZEXT416((uint)fVar20),auVar132);
              auVar124 = vorps_avx(auVar124,auVar135);
              auVar124 = ZEXT416((uint)(fVar20 + auVar124._0_4_));
              auVar124 = vroundss_avx(auVar124,auVar124,0xb);
              *puVar92 = uVar42;
              iVar54 = (int)auVar124._0_4_;
              if ((int)auVar124._0_4_ < -0x7e) {
                iVar54 = -0x7f;
              }
              *puVar87 = uVar60;
              if (0x7e < iVar54) {
                iVar54 = 0x7f;
              }
              *puVar88 = (char)iVar54;
              auVar119._0_4_ = (float)iVar70;
              auVar119._4_12_ = auVar133;
              auVar124 = vfmadd213ss_fma(auVar119,ZEXT416((uint)fVar6),ZEXT416(uVar43));
              fVar20 = fVar7 * auVar124._0_4_;
              auVar124 = vandps_avx(ZEXT416((uint)fVar20),auVar132);
              auVar124 = vorps_avx(auVar124,auVar135);
              auVar124 = ZEXT416((uint)(fVar20 + auVar124._0_4_));
              auVar124 = vroundss_avx(auVar124,auVar124,0xb);
              iVar70 = (int)auVar124._0_4_;
              if (iVar70 < -0x7e) {
                iVar70 = -0x7f;
              }
              uVar42 = (undefined1)iVar70;
              if (0x7e < iVar70) {
                uVar42 = 0x7f;
              }
              *puVar80 = uVar42;
              puVar92 = puVar92 + 1;
              puVar87 = puVar87 + 1;
              puVar88 = puVar88 + 1;
              puVar80 = puVar80 + 1;
            }
          }
          iVar70 = 0;
          if (0 < iVar76) {
            iVar70 = iVar76;
          }
          local_738._8_4_ = 0x80000000;
          local_738._0_8_ = 0x8000000080000000;
          local_738._12_4_ = 0x80000000;
          local_708._8_4_ = 0x3effffff;
          local_708._0_8_ = 0x3effffff3effffff;
          local_708._12_4_ = 0x3effffff;
          for (; (long)uVar93 < (long)uVar99; uVar93 = uVar93 + 1) {
            iVar54 = (int)uVar93;
            Mat::channel((Mat *)sum0,top_blob,iVar54);
            puVar92 = (undefined1 *)sum0._0_8_;
            Mat::~Mat((Mat *)sum0);
            if (lVar91 == 0) {
              uVar68 = 0;
            }
            else {
              uVar68 = *(uint *)(lVar91 + uVar93 * 4);
            }
            fVar1 = local_160._M_impl.super__Vector_impl_data._M_start[uVar93 * 2];
            fVar127 = local_160._M_impl.super__Vector_impl_data._M_start[uVar93 * 2 + 1];
            iVar54 = (int)((long)((ulong)(uint)(iVar54 >> 0x1f) << 0x20 | uVar93 & 0xffffffff) / 4)
                     * -3 + iVar54;
            uVar47 = 0;
            while( true ) {
              if ((int)uVar62 <= (int)((uint)uVar47 | 3)) break;
              Mat::channel((Mat *)sum0,&img,(int)(uVar47 >> 2));
              lVar77 = sum0._0_8_;
              Mat::~Mat((Mat *)sum0);
              Mat::channel((Mat *)sum0,&kernel_tm,iVar54);
              pcVar71 = (char *)sum0._0_8_;
              Mat::~Mat((Mat *)sum0);
              sum0[0] = 0;
              sum0[1] = 0;
              sum0[2] = 0;
              sum0[3] = 0;
              for (uVar97 = 0; (int)(uVar97 | 1) < iVar76; uVar97 = uVar97 + 2) {
                cVar8 = *pcVar71;
                cVar9 = pcVar71[1];
                for (lVar84 = 0; lVar84 != 4; lVar84 = lVar84 + 1) {
                  sum0[lVar84] = (int)*(char *)(lVar77 + 1 + lVar84 * 2) * (int)cVar9 +
                                 (int)*(char *)(lVar77 + lVar84 * 2) * (int)cVar8 + sum0[lVar84];
                }
                pcVar71 = pcVar71 + 2;
                lVar77 = lVar77 + 8;
              }
              for (; (int)uVar97 < iVar76; uVar97 = uVar97 + 1) {
                cVar8 = *pcVar71;
                for (lVar84 = 0; lVar84 != 4; lVar84 = lVar84 + 1) {
                  sum0[lVar84] = sum0[lVar84] + (int)*(char *)(lVar77 + lVar84) * (int)cVar8;
                }
                pcVar71 = pcVar71 + 1;
                lVar77 = lVar77 + 4;
              }
              for (lVar77 = 0; lVar77 != 4; lVar77 = lVar77 + 1) {
                auVar122._0_4_ = (float)sum0[lVar77];
                auVar122._4_12_ = in_ZMM5._4_12_;
                auVar124 = vfmadd213ss_fma(auVar122,ZEXT416((uint)fVar1),ZEXT416(uVar68));
                fVar2 = auVar124._0_4_ * fVar127;
                auVar124 = vandps_avx(ZEXT416((uint)fVar2),local_738);
                auVar124 = vorps_avx(auVar124,local_708);
                auVar124 = ZEXT416((uint)(fVar2 + auVar124._0_4_));
                auVar124 = vroundss_avx(auVar124,auVar124,0xb);
                iVar69 = (int)auVar124._0_4_;
                if (iVar69 < -0x7e) {
                  iVar69 = -0x7f;
                }
                if (0x7e < iVar69) {
                  iVar69 = 0x7f;
                }
                puVar92[lVar77] = (char)iVar69;
              }
              puVar92 = puVar92 + 4;
              uVar47 = (ulong)((uint)uVar47 + 4);
            }
            while( true ) {
              uVar97 = (uint)uVar47;
              if ((int)uVar62 <= (int)uVar97) break;
              Mat::channel((Mat *)sum0,&img,(uVar97 & 3) + (int)(uVar47 >> 2));
              uVar21 = sum0._0_8_;
              Mat::~Mat((Mat *)sum0);
              Mat::channel((Mat *)sum0,&kernel_tm,iVar54);
              uVar34 = sum0._0_8_;
              Mat::~Mat((Mat *)sum0);
              iVar69 = 0;
              for (lVar77 = 0; iVar70 != (int)lVar77; lVar77 = lVar77 + 1) {
                iVar69 = iVar69 + (int)*(char *)(uVar21 + lVar77) * (int)*(char *)(uVar34 + lVar77);
              }
              auVar123._0_4_ = (float)iVar69;
              auVar123._4_12_ = in_ZMM5._4_12_;
              auVar124 = vfmadd213ss_fma(auVar123,ZEXT416((uint)fVar1),ZEXT416(uVar68));
              fVar2 = auVar124._0_4_ * fVar127;
              auVar124 = vandps_avx(ZEXT416((uint)fVar2),local_738);
              auVar124 = vorps_avx(auVar124,local_708);
              auVar124 = ZEXT416((uint)(fVar2 + auVar124._0_4_));
              auVar124 = vroundss_avx(auVar124,auVar124,0xb);
              iVar69 = (int)auVar124._0_4_;
              if (iVar69 < -0x7e) {
                iVar69 = -0x7f;
              }
              uVar42 = (undefined1)iVar69;
              if (0x7e < iVar69) {
                uVar42 = 0x7f;
              }
              *puVar92 = uVar42;
              puVar92 = puVar92 + 1;
              uVar47 = (ulong)(uVar97 + 1);
            }
          }
          Mat::~Mat(&kernel_tm);
          Mat::~Mat(&img);
          Mat::~Mat((Mat *)&opt_q);
          this_01 = &local_160;
        }
        std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(this_01);
        std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                  (&requantize_scales.super__Vector_base<float,_std::allocator<float>_>);
        pLVar19 = this->activation;
        if (pLVar19 != (Layer *)0x0) {
          (*pLVar19->_vptr_Layer[9])(pLVar19,top_blob,opt);
          iVar70 = 0;
          goto LAB_0017f491;
        }
      }
      iVar70 = 0;
    }
  }
LAB_0017f491:
  Mat::~Mat(&top_blob_int32);
LAB_0017f49e:
  Mat::~Mat(&bottom_blob_bordered);
  Mat::~Mat(&bottom_blob_int8);
  return iVar70;
}

Assistant:

int Convolution_x86_avx2::forward_int8_x86(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int elembits = bottom_blob.elembits();

    Mat bottom_blob_int8 = bottom_blob;
    if (elembits != 8)
    {
        Option opt_q = opt;
        opt_q.blob_allocator = opt.workspace_allocator;
        quantize_to_int8(bottom_blob, bottom_blob_int8, bottom_blob_int8_scales, opt_q);
    }

    //     NCNN_LOGE("Convolution_arm input %d x %d  ksize=%d %d  stride=%d %d", w, h, kernel_w, kernel_h, stride_w, stride_h);

    Mat bottom_blob_bordered;
    make_padding(bottom_blob_int8, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    int w = bottom_blob_bordered.w;
    int h = bottom_blob_bordered.h;
    int channels = bottom_blob_bordered.c;
    int elempack = bottom_blob_bordered.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        out_elempack = num_output % 4 == 0 ? 4 : 1;
    }
#endif // __SSE2__
    bool use_int8_requantize = int8_scale_term > 100;
    size_t out_elemsize = use_int8_requantize ? 1u * out_elempack : 4u * out_elempack;

    //     NCNN_LOGE("forward_int8_arm %d %d %d    %d %d", w, h, bottom_blob_bordered.c, elempack, out_elempack);

    top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    const int num_input = channels * elempack;

    Mat top_blob_int32;
    top_blob_int32.create(outw, outh, num_output / out_elempack, (size_t)(4u * out_elempack), out_elempack, opt.workspace_allocator);
    if (top_blob_int32.empty())
        return -100;

#if __SSE2__
    if (elempack == 8 && out_elempack == 4)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv1x1s1_sgemm_pack8to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_data_int8, opt);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            conv1x1s2_pack8to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_data_int8, opt);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_pack8to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_data_int8, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }
        else
        {
            convolution_pack8to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_data_int8, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }

        Mat scale_in_data(num_output);
        for (int p = 0; p < num_output; p++)
        {
            // requantize and relu
            float scale_in;
            if (weight_data_int8_scales[p] == 0)
                scale_in = 0;
            else
                scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

            scale_in_data[p] = scale_in;
        }

        if (use_int8_requantize)
        {
            requantize_from_int32_to_int8(top_blob_int32, top_blob, scale_in_data, top_blob_int8_scales, bias_data, activation_type, activation_params, opt);
        }
        else
        {
            dequantize_from_int32(top_blob_int32, top_blob, scale_in_data, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
        }
    }

    if (elempack == 1 && out_elempack == 4)
    {
        convolution_pack1to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_data_int8, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);

        Mat scale_in_data(num_output);
        for (int p = 0; p < num_output; p++)
        {
            // requantize and relu
            float scale_in;
            if (weight_data_int8_scales[p] == 0)
                scale_in = 0;
            else
                scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

            scale_in_data[p] = scale_in;
        }

        if (use_int8_requantize)
        {
            requantize_from_int32_to_int8(top_blob_int32, top_blob, scale_in_data, top_blob_int8_scales, bias_data, activation_type, activation_params, opt);
        }
        else
        {
            dequantize_from_int32(top_blob_int32, top_blob, scale_in_data, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
        }
    }

    if (elempack == 8 && out_elempack == 1)
    {
        convolution_pack8to1_int8_sse(bottom_blob_bordered, top_blob_int32, weight_data_int8, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);

        Mat scale_in_data(num_output);
        for (int p = 0; p < num_output; p++)
        {
            // requantize and relu
            float scale_in;
            if (weight_data_int8_scales[p] == 0)
                scale_in = 0;
            else
                scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

            scale_in_data[p] = scale_in;
        }

        if (use_int8_requantize)
        {
            requantize_from_int32_to_int8(top_blob_int32, top_blob, scale_in_data, top_blob_int8_scales, bias_data, activation_type, activation_params, opt);
        }
        else
        {
            dequantize_from_int32(top_blob_int32, top_blob, scale_in_data, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
        }
    }
#endif // __SSE2__

    if (elempack == 1 && out_elempack == 1)
    {
        if (opt.use_winograd_convolution && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1 && num_input >= 16 && num_output >= 16)
        {
            conv3x3s1_winograd23_int8_sse(bottom_blob_bordered, top_blob_int32, weight_data_3x3_winograd23_int8, opt);
            //             conv3x3s1_winograd43_int8_sse(bottom_blob_bordered, top_blob_int32, weight_data_3x3_winograd23_int8, opt);

            Mat scale_in_data(num_output);
            for (int p = 0; p < num_output; p++)
            {
                // requantize and relu
                float scale_in;
                if (weight_data_int8_scales[p] == 0)
                    scale_in = 0;
                else
                    scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

                scale_in_data[p] = scale_in;
            }

            if (use_int8_requantize)
            {
                requantize_from_int32_to_int8(top_blob_int32, top_blob, scale_in_data, top_blob_int8_scales, bias_data, activation_type, activation_params, opt);
            }
            else
            {
                dequantize_from_int32(top_blob_int32, top_blob, scale_in_data, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }
            }
        }
        else if (opt.use_sgemm_convolution && dilation_w == 1 && dilation_h == 1 && (activation_type == 0 || activation_type == 1))
        {
            if (use_int8_requantize)
            {
                std::vector<float> requantize_scales;
                for (int p = 0; p < num_output; p++)
                {
                    float scale_in;
                    if (weight_data_int8_scales[p] == 0)
                        scale_in = 0;
                    else
                        scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

                    float scale_out = top_blob_int8_scales[0];

                    requantize_scales.push_back(scale_in);
                    requantize_scales.push_back(scale_out);
                }

                conv_im2col_sgemm_int8_requant_sse(bottom_blob_bordered, top_blob, weight_data, kernel_w, kernel_h, stride_w, stride_h, bias_data, requantize_scales, opt);
            }
            else
            {
                std::vector<float> dequantize_scales;
                for (int p = 0; p < num_output; p++)
                {
                    float scale_in;
                    if (weight_data_int8_scales[p] == 0)
                        scale_in = 0;
                    else
                        scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

                    dequantize_scales.push_back(scale_in);
                }

                conv_im2col_sgemm_int8_dequant_sse(bottom_blob_bordered, top_blob, weight_data, kernel_w, kernel_h, stride_w, stride_h, bias_data, dequantize_scales, opt);
            }

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
        }
        else
        {
            //         convolution_int8(bottom_blob_bordered, top_blob_int32, weight_data_int8, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
            convolution_int8(bottom_blob_bordered, top_blob_int32, weight_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);

            Mat scale_in_data(num_output);
            for (int p = 0; p < num_output; p++)
            {
                // requantize and relu
                float scale_in;
                if (weight_data_int8_scales[p] == 0)
                    scale_in = 0;
                else
                    scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

                scale_in_data[p] = scale_in;
            }

            if (use_int8_requantize)
            {
                requantize_from_int32_to_int8(top_blob_int32, top_blob, scale_in_data, top_blob_int8_scales, bias_data, activation_type, activation_params, opt);
            }
            else
            {
                dequantize_from_int32(top_blob_int32, top_blob, scale_in_data, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }
            }
        }
    }

    return 0;
}